

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  int iVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  byte bVar71;
  byte bVar72;
  ulong uVar73;
  byte bVar74;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  ulong uVar75;
  ulong uVar76;
  byte bVar77;
  byte bVar78;
  uint uVar79;
  ulong uVar80;
  byte bVar81;
  byte bVar82;
  long lVar83;
  bool bVar84;
  bool bVar85;
  uint uVar86;
  uint uVar146;
  uint uVar147;
  uint uVar149;
  uint uVar150;
  uint uVar151;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  uint uVar148;
  uint uVar152;
  undefined1 auVar137 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar138 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float pp;
  float fVar153;
  undefined4 uVar154;
  float fVar155;
  undefined1 auVar156 [16];
  undefined1 auVar198 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar218;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar216;
  float fVar217;
  undefined1 auVar215 [64];
  float fVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar240;
  float fVar241;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar243;
  undefined1 auVar242 [64];
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  float fVar249;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar250 [64];
  float fVar255;
  undefined1 auVar256 [64];
  float fVar259;
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_910;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  undefined1 local_770 [16];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  RTCHitN local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte local_180 [32];
  undefined1 auStack_160 [32];
  float local_140 [2];
  int local_138 [66];
  undefined1 auVar131 [32];
  undefined1 auVar139 [32];
  undefined1 auVar142 [32];
  undefined1 auVar265 [64];
  
  PVar2 = prim[1];
  uVar73 = (ulong)(byte)PVar2;
  fVar249 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar92 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar91 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  fVar219 = fVar249 * auVar91._0_4_;
  fVar153 = fVar249 * auVar92._0_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar73 * 4 + 6);
  auVar101 = vpmovsxbd_avx2(auVar13);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar73 * 5 + 6);
  auVar100 = vpmovsxbd_avx2(auVar14);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar73 * 6 + 6);
  auVar102 = vpmovsxbd_avx2(auVar89);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar103 = vpmovsxbd_avx2(auVar198);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar104 = vpmovsxbd_avx2(auVar87);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar73 + 6);
  auVar105 = vpmovsxbd_avx2(auVar1);
  auVar105 = vcvtdq2ps_avx(auVar105);
  uVar80 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar80 + 6);
  auVar106 = vpmovsxbd_avx2(auVar90);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar80 + uVar73 + 6);
  auVar109 = vpmovsxbd_avx2(auVar88);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar107 = vcvtdq2ps_avx(auVar109);
  uVar76 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar230._8_8_ = 0;
  auVar230._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar98 = vpmovsxbd_avx2(auVar230);
  auVar108 = vcvtdq2ps_avx(auVar98);
  auVar117._4_4_ = fVar153;
  auVar117._0_4_ = fVar153;
  auVar117._8_4_ = fVar153;
  auVar117._12_4_ = fVar153;
  auVar117._16_4_ = fVar153;
  auVar117._20_4_ = fVar153;
  auVar117._24_4_ = fVar153;
  auVar117._28_4_ = fVar153;
  auVar119._8_4_ = 1;
  auVar119._0_8_ = 0x100000001;
  auVar119._12_4_ = 1;
  auVar119._16_4_ = 1;
  auVar119._20_4_ = 1;
  auVar119._24_4_ = 1;
  auVar119._28_4_ = 1;
  auVar110 = ZEXT1632(CONCAT412(fVar249 * auVar92._12_4_,
                                CONCAT48(fVar249 * auVar92._8_4_,
                                         CONCAT44(fVar249 * auVar92._4_4_,fVar153))));
  auVar99 = vpermps_avx2(auVar119,auVar110);
  auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar97 = vpermps_avx512vl(auVar96,auVar110);
  fVar153 = auVar97._0_4_;
  fVar251 = auVar97._4_4_;
  auVar110._4_4_ = fVar251 * auVar102._4_4_;
  auVar110._0_4_ = fVar153 * auVar102._0_4_;
  fVar252 = auVar97._8_4_;
  auVar110._8_4_ = fVar252 * auVar102._8_4_;
  fVar253 = auVar97._12_4_;
  auVar110._12_4_ = fVar253 * auVar102._12_4_;
  fVar244 = auVar97._16_4_;
  auVar110._16_4_ = fVar244 * auVar102._16_4_;
  fVar245 = auVar97._20_4_;
  auVar110._20_4_ = fVar245 * auVar102._20_4_;
  fVar254 = auVar97._24_4_;
  auVar110._24_4_ = fVar254 * auVar102._24_4_;
  auVar110._28_4_ = auVar109._28_4_;
  auVar109._4_4_ = auVar105._4_4_ * fVar251;
  auVar109._0_4_ = auVar105._0_4_ * fVar153;
  auVar109._8_4_ = auVar105._8_4_ * fVar252;
  auVar109._12_4_ = auVar105._12_4_ * fVar253;
  auVar109._16_4_ = auVar105._16_4_ * fVar244;
  auVar109._20_4_ = auVar105._20_4_ * fVar245;
  auVar109._24_4_ = auVar105._24_4_ * fVar254;
  auVar109._28_4_ = auVar98._28_4_;
  auVar98._4_4_ = auVar108._4_4_ * fVar251;
  auVar98._0_4_ = auVar108._0_4_ * fVar153;
  auVar98._8_4_ = auVar108._8_4_ * fVar252;
  auVar98._12_4_ = auVar108._12_4_ * fVar253;
  auVar98._16_4_ = auVar108._16_4_ * fVar244;
  auVar98._20_4_ = auVar108._20_4_ * fVar245;
  auVar98._24_4_ = auVar108._24_4_ * fVar254;
  auVar98._28_4_ = auVar97._28_4_;
  auVar13 = vfmadd231ps_fma(auVar110,auVar99,auVar100);
  auVar14 = vfmadd231ps_fma(auVar109,auVar99,auVar104);
  auVar89 = vfmadd231ps_fma(auVar98,auVar107,auVar99);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar117,auVar101);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar117,auVar103);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar106,auVar117);
  auVar118._4_4_ = fVar219;
  auVar118._0_4_ = fVar219;
  auVar118._8_4_ = fVar219;
  auVar118._12_4_ = fVar219;
  auVar118._16_4_ = fVar219;
  auVar118._20_4_ = fVar219;
  auVar118._24_4_ = fVar219;
  auVar118._28_4_ = fVar219;
  auVar98 = ZEXT1632(CONCAT412(fVar249 * auVar91._12_4_,
                               CONCAT48(fVar249 * auVar91._8_4_,
                                        CONCAT44(fVar249 * auVar91._4_4_,fVar219))));
  auVar109 = vpermps_avx2(auVar119,auVar98);
  auVar98 = vpermps_avx512vl(auVar96,auVar98);
  auVar99 = vmulps_avx512vl(auVar98,auVar102);
  auVar112._0_4_ = auVar98._0_4_ * auVar105._0_4_;
  auVar112._4_4_ = auVar98._4_4_ * auVar105._4_4_;
  auVar112._8_4_ = auVar98._8_4_ * auVar105._8_4_;
  auVar112._12_4_ = auVar98._12_4_ * auVar105._12_4_;
  auVar112._16_4_ = auVar98._16_4_ * auVar105._16_4_;
  auVar112._20_4_ = auVar98._20_4_ * auVar105._20_4_;
  auVar112._24_4_ = auVar98._24_4_ * auVar105._24_4_;
  auVar112._28_4_ = 0;
  auVar105._4_4_ = auVar98._4_4_ * auVar108._4_4_;
  auVar105._0_4_ = auVar98._0_4_ * auVar108._0_4_;
  auVar105._8_4_ = auVar98._8_4_ * auVar108._8_4_;
  auVar105._12_4_ = auVar98._12_4_ * auVar108._12_4_;
  auVar105._16_4_ = auVar98._16_4_ * auVar108._16_4_;
  auVar105._20_4_ = auVar98._20_4_ * auVar108._20_4_;
  auVar105._24_4_ = auVar98._24_4_ * auVar108._24_4_;
  auVar105._28_4_ = auVar102._28_4_;
  auVar100 = vfmadd231ps_avx512vl(auVar99,auVar109,auVar100);
  auVar198 = vfmadd231ps_fma(auVar112,auVar109,auVar104);
  auVar87 = vfmadd231ps_fma(auVar105,auVar109,auVar107);
  auVar100 = vfmadd231ps_avx512vl(auVar100,auVar118,auVar101);
  auVar198 = vfmadd231ps_fma(ZEXT1632(auVar198),auVar118,auVar103);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar118,auVar106);
  auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar267 = ZEXT3264(auVar101);
  vandps_avx512vl(ZEXT1632(auVar13),auVar101);
  auVar114._8_4_ = 0x219392ef;
  auVar114._0_8_ = 0x219392ef219392ef;
  auVar114._12_4_ = 0x219392ef;
  auVar114._16_4_ = 0x219392ef;
  auVar114._20_4_ = 0x219392ef;
  auVar114._24_4_ = 0x219392ef;
  auVar114._28_4_ = 0x219392ef;
  uVar80 = vcmpps_avx512vl(auVar101,auVar114,1);
  bVar85 = (bool)((byte)uVar80 & 1);
  auVar99._0_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar13._0_4_;
  bVar85 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar13._4_4_;
  bVar85 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar13._8_4_;
  bVar85 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar13._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar14),auVar101);
  uVar80 = vcmpps_avx512vl(auVar99,auVar114,1);
  bVar85 = (bool)((byte)uVar80 & 1);
  auVar96._0_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar14._0_4_;
  bVar85 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar14._4_4_;
  bVar85 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar14._8_4_;
  bVar85 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar14._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar89),auVar101);
  uVar80 = vcmpps_avx512vl(auVar96,auVar114,1);
  bVar85 = (bool)((byte)uVar80 & 1);
  auVar101._0_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar89._0_4_;
  bVar85 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar89._4_4_;
  bVar85 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar89._8_4_;
  bVar85 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar89._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar102 = vrcp14ps_avx512vl(auVar99);
  auVar116._8_4_ = 0x3f800000;
  auVar116._0_8_ = &DAT_3f8000003f800000;
  auVar116._12_4_ = 0x3f800000;
  auVar116._16_4_ = 0x3f800000;
  auVar116._20_4_ = 0x3f800000;
  auVar116._24_4_ = 0x3f800000;
  auVar116._28_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar99,auVar102,auVar116);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar96);
  auVar14 = vfnmadd213ps_fma(auVar96,auVar102,auVar116);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar101);
  auVar89 = vfnmadd213ps_fma(auVar101,auVar102,auVar116);
  auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar102,auVar102);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 7 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar102 = vsubps_avx512vl(auVar101,auVar100);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 9 + 6));
  auVar106._4_4_ = auVar13._4_4_ * auVar102._4_4_;
  auVar106._0_4_ = auVar13._0_4_ * auVar102._0_4_;
  auVar106._8_4_ = auVar13._8_4_ * auVar102._8_4_;
  auVar106._12_4_ = auVar13._12_4_ * auVar102._12_4_;
  auVar106._16_4_ = auVar102._16_4_ * 0.0;
  auVar106._20_4_ = auVar102._20_4_ * 0.0;
  auVar106._24_4_ = auVar102._24_4_ * 0.0;
  auVar106._28_4_ = auVar102._28_4_;
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx512vl(auVar101,auVar100);
  auVar113._0_4_ = auVar13._0_4_ * auVar101._0_4_;
  auVar113._4_4_ = auVar13._4_4_ * auVar101._4_4_;
  auVar113._8_4_ = auVar13._8_4_ * auVar101._8_4_;
  auVar113._12_4_ = auVar13._12_4_ * auVar101._12_4_;
  auVar113._16_4_ = auVar101._16_4_ * 0.0;
  auVar113._20_4_ = auVar101._20_4_ * 0.0;
  auVar113._24_4_ = auVar101._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar2 * 0x10 + uVar73 * -2 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar198));
  auVar107._4_4_ = auVar14._4_4_ * auVar101._4_4_;
  auVar107._0_4_ = auVar14._0_4_ * auVar101._0_4_;
  auVar107._8_4_ = auVar14._8_4_ * auVar101._8_4_;
  auVar107._12_4_ = auVar14._12_4_ * auVar101._12_4_;
  auVar107._16_4_ = auVar101._16_4_ * 0.0;
  auVar107._20_4_ = auVar101._20_4_ * 0.0;
  auVar107._24_4_ = auVar101._24_4_ * 0.0;
  auVar107._28_4_ = auVar101._28_4_;
  auVar101 = vcvtdq2ps_avx(auVar100);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar198));
  auVar111._0_4_ = auVar14._0_4_ * auVar101._0_4_;
  auVar111._4_4_ = auVar14._4_4_ * auVar101._4_4_;
  auVar111._8_4_ = auVar14._8_4_ * auVar101._8_4_;
  auVar111._12_4_ = auVar14._12_4_ * auVar101._12_4_;
  auVar111._16_4_ = auVar101._16_4_ * 0.0;
  auVar111._20_4_ = auVar101._20_4_ * 0.0;
  auVar111._24_4_ = auVar101._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 + uVar73 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar87));
  auVar108._4_4_ = auVar101._4_4_ * auVar89._4_4_;
  auVar108._0_4_ = auVar101._0_4_ * auVar89._0_4_;
  auVar108._8_4_ = auVar101._8_4_ * auVar89._8_4_;
  auVar108._12_4_ = auVar101._12_4_ * auVar89._12_4_;
  auVar108._16_4_ = auVar101._16_4_ * 0.0;
  auVar108._20_4_ = auVar101._20_4_ * 0.0;
  auVar108._24_4_ = auVar101._24_4_ * 0.0;
  auVar108._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x17 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar87));
  auVar97._0_4_ = auVar89._0_4_ * auVar101._0_4_;
  auVar97._4_4_ = auVar89._4_4_ * auVar101._4_4_;
  auVar97._8_4_ = auVar89._8_4_ * auVar101._8_4_;
  auVar97._12_4_ = auVar89._12_4_ * auVar101._12_4_;
  auVar97._16_4_ = auVar101._16_4_ * 0.0;
  auVar97._20_4_ = auVar101._20_4_ * 0.0;
  auVar97._24_4_ = auVar101._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar101 = vpminsd_avx2(auVar106,auVar113);
  auVar100 = vpminsd_avx2(auVar107,auVar111);
  auVar101 = vmaxps_avx(auVar101,auVar100);
  auVar100 = vpminsd_avx2(auVar108,auVar97);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar102._4_4_ = uVar154;
  auVar102._0_4_ = uVar154;
  auVar102._8_4_ = uVar154;
  auVar102._12_4_ = uVar154;
  auVar102._16_4_ = uVar154;
  auVar102._20_4_ = uVar154;
  auVar102._24_4_ = uVar154;
  auVar102._28_4_ = uVar154;
  auVar100 = vmaxps_avx512vl(auVar100,auVar102);
  auVar101 = vmaxps_avx(auVar101,auVar100);
  auVar100._8_4_ = 0x3f7ffffa;
  auVar100._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar100._12_4_ = 0x3f7ffffa;
  auVar100._16_4_ = 0x3f7ffffa;
  auVar100._20_4_ = 0x3f7ffffa;
  auVar100._24_4_ = 0x3f7ffffa;
  auVar100._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar101,auVar100);
  auVar101 = vpmaxsd_avx2(auVar106,auVar113);
  auVar100 = vpmaxsd_avx2(auVar107,auVar111);
  auVar101 = vminps_avx(auVar101,auVar100);
  auVar100 = vpmaxsd_avx2(auVar108,auVar97);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar103._4_4_ = uVar154;
  auVar103._0_4_ = uVar154;
  auVar103._8_4_ = uVar154;
  auVar103._12_4_ = uVar154;
  auVar103._16_4_ = uVar154;
  auVar103._20_4_ = uVar154;
  auVar103._24_4_ = uVar154;
  auVar103._28_4_ = uVar154;
  auVar100 = vminps_avx512vl(auVar100,auVar103);
  auVar101 = vminps_avx(auVar101,auVar100);
  auVar104._8_4_ = 0x3f800003;
  auVar104._0_8_ = 0x3f8000033f800003;
  auVar104._12_4_ = 0x3f800003;
  auVar104._16_4_ = 0x3f800003;
  auVar104._20_4_ = 0x3f800003;
  auVar104._24_4_ = 0x3f800003;
  auVar104._28_4_ = 0x3f800003;
  auVar101 = vmulps_avx512vl(auVar101,auVar104);
  auVar100 = vpbroadcastd_avx512vl();
  uVar17 = vpcmpgtd_avx512vl(auVar100,_DAT_0205a920);
  uVar15 = vcmpps_avx512vl(local_420,auVar101,2);
  bVar84 = (byte)((byte)uVar15 & (byte)uVar17) == 0;
  bVar85 = !bVar84;
  if (bVar84) {
    return bVar85;
  }
  uVar80 = (ulong)(byte)((byte)uVar15 & (byte)uVar17);
  local_6a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
LAB_01e1043b:
  lVar83 = 0;
  for (uVar73 = uVar80; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
    lVar83 = lVar83 + 1;
  }
  uVar79 = *(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[uVar79].ptr;
  uVar73 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar83 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar83 = *(long *)&pGVar4[1].time_range.upper;
  auVar13 = *(undefined1 (*) [16])(lVar83 + (long)p_Var5 * uVar73);
  auVar14 = *(undefined1 (*) [16])(lVar83 + (uVar73 + 1) * (long)p_Var5);
  auVar89 = *(undefined1 (*) [16])(lVar83 + (uVar73 + 2) * (long)p_Var5);
  uVar80 = uVar80 - 1 & uVar80;
  auVar198 = *(undefined1 (*) [16])(lVar83 + (uVar73 + 3) * (long)p_Var5);
  if (uVar80 != 0) {
    uVar76 = uVar80 - 1 & uVar80;
    for (uVar73 = uVar80; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
    }
    if (uVar76 != 0) {
      for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar1 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar95._4_4_ = uVar154;
  auVar95._0_4_ = uVar154;
  auVar95._8_4_ = uVar154;
  auVar95._12_4_ = uVar154;
  local_5c0._16_4_ = uVar154;
  local_5c0._0_16_ = auVar95;
  local_5c0._20_4_ = uVar154;
  local_5c0._24_4_ = uVar154;
  local_5c0._28_4_ = uVar154;
  auVar262 = ZEXT3264(local_5c0);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar263._4_4_ = uVar154;
  auVar263._0_4_ = uVar154;
  auVar263._8_4_ = uVar154;
  auVar263._12_4_ = uVar154;
  local_5e0._16_4_ = uVar154;
  local_5e0._0_16_ = auVar263;
  local_5e0._20_4_ = uVar154;
  local_5e0._24_4_ = uVar154;
  local_5e0._28_4_ = uVar154;
  auVar265 = ZEXT3264(local_5e0);
  auVar87 = vunpcklps_avx(auVar95,auVar263);
  fVar249 = *(float *)(ray + k * 4 + 0xc0);
  auVar266._4_4_ = fVar249;
  auVar266._0_4_ = fVar249;
  auVar266._8_4_ = fVar249;
  auVar266._12_4_ = fVar249;
  local_600._16_4_ = fVar249;
  local_600._0_16_ = auVar266;
  local_600._20_4_ = fVar249;
  local_600._24_4_ = fVar249;
  local_600._28_4_ = fVar249;
  local_890 = vinsertps_avx(auVar87,auVar266,0x28);
  auVar250 = ZEXT1664(local_890);
  auVar91._0_4_ = auVar13._0_4_ + auVar14._0_4_ + auVar89._0_4_ + auVar198._0_4_;
  auVar91._4_4_ = auVar13._4_4_ + auVar14._4_4_ + auVar89._4_4_ + auVar198._4_4_;
  auVar91._8_4_ = auVar13._8_4_ + auVar14._8_4_ + auVar89._8_4_ + auVar198._8_4_;
  auVar91._12_4_ = auVar13._12_4_ + auVar14._12_4_ + auVar89._12_4_ + auVar198._12_4_;
  auVar92._8_4_ = 0x3e800000;
  auVar92._0_8_ = 0x3e8000003e800000;
  auVar92._12_4_ = 0x3e800000;
  auVar87 = vmulps_avx512vl(auVar91,auVar92);
  auVar87 = vsubps_avx(auVar87,auVar1);
  auVar87 = vdpps_avx(auVar87,local_890,0x7f);
  fVar153 = *(float *)(ray + k * 4 + 0x60);
  auVar256 = ZEXT464((uint)fVar153);
  local_8a0 = vdpps_avx(local_890,local_890,0x7f);
  auVar258 = ZEXT1664(local_8a0);
  auVar93._4_12_ = ZEXT812(0) << 0x20;
  auVar93._0_4_ = local_8a0._0_4_;
  auVar88 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar93);
  auVar90 = vfnmadd213ss_fma(auVar88,local_8a0,ZEXT416(0x40000000));
  local_220 = auVar87._0_4_ * auVar88._0_4_ * auVar90._0_4_;
  auVar242 = ZEXT464((uint)local_220);
  auVar94._4_4_ = local_220;
  auVar94._0_4_ = local_220;
  auVar94._8_4_ = local_220;
  auVar94._12_4_ = local_220;
  fStack_730 = local_220;
  _local_740 = auVar94;
  fStack_72c = local_220;
  fStack_728 = local_220;
  fStack_724 = local_220;
  auVar87 = vfmadd231ps_fma(auVar1,local_890,auVar94);
  auVar87 = vblendps_avx(auVar87,ZEXT816(0) << 0x40,8);
  auVar13 = vsubps_avx(auVar13,auVar87);
  auVar89 = vsubps_avx(auVar89,auVar87);
  auVar14 = vsubps_avx(auVar14,auVar87);
  auVar248 = ZEXT1664(auVar14);
  auVar198 = vsubps_avx(auVar198,auVar87);
  local_240 = vbroadcastss_avx512vl(auVar13);
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  local_820 = ZEXT1632(auVar13);
  local_260 = vpermps_avx512vl(auVar120,local_820);
  auVar121._8_4_ = 2;
  auVar121._0_8_ = 0x200000002;
  auVar121._12_4_ = 2;
  auVar121._16_4_ = 2;
  auVar121._20_4_ = 2;
  auVar121._24_4_ = 2;
  auVar121._28_4_ = 2;
  local_280 = vpermps_avx512vl(auVar121,local_820);
  auVar122._8_4_ = 3;
  auVar122._0_8_ = 0x300000003;
  auVar122._12_4_ = 3;
  auVar122._16_4_ = 3;
  auVar122._20_4_ = 3;
  auVar122._24_4_ = 3;
  auVar122._28_4_ = 3;
  local_2a0 = vpermps_avx512vl(auVar122,local_820);
  local_2c0 = vbroadcastss_avx512vl(auVar14);
  local_860 = ZEXT1632(auVar14);
  local_2e0 = vpermps_avx512vl(auVar120,local_860);
  local_300 = vpermps_avx512vl(auVar121,local_860);
  local_320 = vpermps_avx512vl(auVar122,local_860);
  local_340 = vbroadcastss_avx512vl(auVar89);
  local_840 = ZEXT1632(auVar89);
  local_360 = vpermps_avx512vl(auVar120,local_840);
  local_380 = vpermps_avx512vl(auVar121,local_840);
  local_3a0 = vpermps_avx512vl(auVar122,local_840);
  local_3c0 = vbroadcastss_avx512vl(auVar198);
  _local_880 = ZEXT1632(auVar198);
  _local_1e0 = vpermps_avx2(auVar120,_local_880);
  local_620 = vpermps_avx512vl(auVar121,_local_880);
  local_400 = vpermps_avx2(auVar122,_local_880);
  auVar13 = vfmadd231ps_fma(ZEXT432((uint)(fVar249 * fVar249)),local_5e0,local_5e0);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_5c0,local_5c0);
  uVar154 = auVar13._0_4_;
  local_200._4_4_ = uVar154;
  local_200._0_4_ = uVar154;
  local_200._8_4_ = uVar154;
  local_200._12_4_ = uVar154;
  local_200._16_4_ = uVar154;
  local_200._20_4_ = uVar154;
  local_200._24_4_ = uVar154;
  local_200._28_4_ = uVar154;
  vandps_avx512vl(local_200,auVar267._0_32_);
  local_7d0 = ZEXT416((uint)local_220);
  local_220 = fVar153 - local_220;
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  fStack_210 = local_220;
  fStack_20c = local_220;
  fStack_208 = local_220;
  fStack_204 = local_220;
  local_660 = vpbroadcastd_avx512vl();
  iVar3 = 1;
  uVar73 = 0;
  bVar81 = 0;
  local_680 = vpbroadcastd_avx512vl();
  auVar13 = vsqrtss_avx(local_8a0,local_8a0);
  auVar14 = vsqrtss_avx(local_8a0,local_8a0);
  auVar215 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar229 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  local_3e0 = local_620;
  do {
    auVar198 = auVar215._0_16_;
    auVar89 = vmovshdup_avx(auVar198);
    fVar249 = auVar215._0_4_;
    fVar259 = auVar89._0_4_ - fVar249;
    fVar246 = fVar259 * 0.04761905;
    auVar235._4_4_ = fVar249;
    auVar235._0_4_ = fVar249;
    auVar235._8_4_ = fVar249;
    auVar235._12_4_ = fVar249;
    auVar235._16_4_ = fVar249;
    auVar235._20_4_ = fVar249;
    auVar235._24_4_ = fVar249;
    auVar235._28_4_ = fVar249;
    local_8c0._4_4_ = fVar259;
    local_8c0._0_4_ = fVar259;
    local_8c0._8_4_ = fVar259;
    local_8c0._12_4_ = fVar259;
    local_8c0._16_4_ = fVar259;
    local_8c0._20_4_ = fVar259;
    local_8c0._24_4_ = fVar259;
    local_8c0._28_4_ = fVar259;
    auVar89 = vfmadd231ps_fma(auVar235,local_8c0,_DAT_02020f20);
    auVar101 = vsubps_avx(auVar229._0_32_,ZEXT1632(auVar89));
    fVar249 = auVar101._0_4_;
    fVar252 = auVar101._4_4_;
    fVar244 = auVar101._8_4_;
    fVar254 = auVar101._12_4_;
    fVar240 = auVar101._16_4_;
    fVar255 = auVar101._20_4_;
    fVar241 = auVar101._24_4_;
    fVar155 = fVar249 * fVar249 * fVar249;
    fVar173 = fVar252 * fVar252 * fVar252;
    auVar130._4_4_ = fVar173;
    auVar130._0_4_ = fVar155;
    fVar174 = fVar244 * fVar244 * fVar244;
    auVar130._8_4_ = fVar174;
    fVar175 = fVar254 * fVar254 * fVar254;
    auVar130._12_4_ = fVar175;
    fVar176 = fVar240 * fVar240 * fVar240;
    auVar130._16_4_ = fVar176;
    fVar177 = fVar255 * fVar255 * fVar255;
    auVar130._20_4_ = fVar177;
    fVar178 = fVar241 * fVar241 * fVar241;
    auVar130._24_4_ = fVar178;
    auVar130._28_4_ = fVar259;
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar102 = vmulps_avx512vl(auVar130,auVar100);
    fVar251 = auVar89._0_4_;
    fVar253 = auVar89._4_4_;
    fVar245 = auVar89._8_4_;
    fVar219 = auVar89._12_4_;
    fVar197 = fVar251 * fVar251 * fVar251;
    fVar216 = fVar253 * fVar253 * fVar253;
    fVar217 = fVar245 * fVar245 * fVar245;
    fVar218 = fVar219 * fVar219 * fVar219;
    auVar267._28_36_ = auVar215._28_36_;
    auVar267._0_28_ = ZEXT1628(CONCAT412(fVar218,CONCAT48(fVar217,CONCAT44(fVar216,fVar197))));
    auVar229._0_4_ = fVar251 * fVar249;
    auVar229._4_4_ = fVar253 * fVar252;
    auVar229._8_4_ = fVar245 * fVar244;
    auVar229._12_4_ = fVar219 * fVar254;
    auVar229._16_4_ = fVar240 * 0.0;
    auVar229._20_4_ = fVar255 * 0.0;
    auVar229._28_36_ = auVar256._28_36_;
    auVar229._24_4_ = fVar241 * 0.0;
    auVar103 = vmulps_avx512vl(auVar267._0_32_,auVar100);
    fVar259 = auVar103._28_4_ + fVar259;
    fVar32 = auVar262._28_4_;
    fVar243 = fVar259 + fVar32 + auVar242._28_4_;
    auVar33._4_4_ = fVar173 * 0.16666667;
    auVar33._0_4_ = fVar155 * 0.16666667;
    auVar33._8_4_ = fVar174 * 0.16666667;
    auVar33._12_4_ = fVar175 * 0.16666667;
    auVar33._16_4_ = fVar176 * 0.16666667;
    auVar33._20_4_ = fVar177 * 0.16666667;
    auVar33._24_4_ = fVar178 * 0.16666667;
    auVar33._28_4_ = fVar259;
    auVar34._4_4_ =
         (auVar229._4_4_ * fVar252 * 12.0 + auVar229._4_4_ * fVar253 * 6.0 +
         fVar216 + auVar102._4_4_) * 0.16666667;
    auVar34._0_4_ =
         (auVar229._0_4_ * fVar249 * 12.0 + auVar229._0_4_ * fVar251 * 6.0 +
         fVar197 + auVar102._0_4_) * 0.16666667;
    auVar34._8_4_ =
         (auVar229._8_4_ * fVar244 * 12.0 + auVar229._8_4_ * fVar245 * 6.0 +
         fVar217 + auVar102._8_4_) * 0.16666667;
    auVar34._12_4_ =
         (auVar229._12_4_ * fVar254 * 12.0 + auVar229._12_4_ * fVar219 * 6.0 +
         fVar218 + auVar102._12_4_) * 0.16666667;
    auVar34._16_4_ =
         (auVar229._16_4_ * fVar240 * 12.0 + auVar229._16_4_ * 0.0 * 6.0 + auVar102._16_4_ + 0.0) *
         0.16666667;
    auVar34._20_4_ =
         (auVar229._20_4_ * fVar255 * 12.0 + auVar229._20_4_ * 0.0 * 6.0 + auVar102._20_4_ + 0.0) *
         0.16666667;
    auVar34._24_4_ =
         (auVar229._24_4_ * fVar241 * 12.0 + auVar229._24_4_ * 0.0 * 6.0 + auVar102._24_4_ + 0.0) *
         0.16666667;
    auVar34._28_4_ = fVar32;
    auVar35._4_4_ =
         (auVar103._4_4_ + fVar173 +
         auVar229._4_4_ * fVar253 * 12.0 + auVar229._4_4_ * fVar252 * 6.0) * 0.16666667;
    auVar35._0_4_ =
         (auVar103._0_4_ + fVar155 +
         auVar229._0_4_ * fVar251 * 12.0 + auVar229._0_4_ * fVar249 * 6.0) * 0.16666667;
    auVar35._8_4_ =
         (auVar103._8_4_ + fVar174 +
         auVar229._8_4_ * fVar245 * 12.0 + auVar229._8_4_ * fVar244 * 6.0) * 0.16666667;
    auVar35._12_4_ =
         (auVar103._12_4_ + fVar175 +
         auVar229._12_4_ * fVar219 * 12.0 + auVar229._12_4_ * fVar254 * 6.0) * 0.16666667;
    auVar35._16_4_ =
         (auVar103._16_4_ + fVar176 + auVar229._16_4_ * 0.0 * 12.0 + auVar229._16_4_ * fVar240 * 6.0
         ) * 0.16666667;
    auVar35._20_4_ =
         (auVar103._20_4_ + fVar177 + auVar229._20_4_ * 0.0 * 12.0 + auVar229._20_4_ * fVar255 * 6.0
         ) * 0.16666667;
    auVar35._24_4_ =
         (auVar103._24_4_ + fVar178 + auVar229._24_4_ * 0.0 * 12.0 + auVar229._24_4_ * fVar241 * 6.0
         ) * 0.16666667;
    auVar35._28_4_ = auVar265._28_4_;
    fVar197 = fVar197 * 0.16666667;
    fVar216 = fVar216 * 0.16666667;
    fVar217 = fVar217 * 0.16666667;
    fVar218 = fVar218 * 0.16666667;
    auVar36._28_4_ = fVar243;
    auVar36._0_28_ = ZEXT1628(CONCAT412(fVar218,CONCAT48(fVar217,CONCAT44(fVar216,fVar197))));
    auVar103 = vmulps_avx512vl(local_3c0,auVar36);
    auVar37._4_4_ = (float)local_1e0._4_4_ * fVar216;
    auVar37._0_4_ = (float)local_1e0._0_4_ * fVar197;
    auVar37._8_4_ = fStack_1d8 * fVar217;
    auVar37._12_4_ = fStack_1d4 * fVar218;
    auVar37._16_4_ = fStack_1d0 * 0.0;
    auVar37._20_4_ = fStack_1cc * 0.0;
    auVar37._24_4_ = fStack_1c8 * 0.0;
    auVar37._28_4_ = auVar258._28_4_ + auVar265._28_4_ + auVar215._28_4_ + auVar102._28_4_;
    auVar102 = vmulps_avx512vl(local_3e0,auVar36);
    auVar38._4_4_ = local_400._4_4_ * fVar216;
    auVar38._0_4_ = local_400._0_4_ * fVar197;
    auVar38._8_4_ = local_400._8_4_ * fVar217;
    auVar38._12_4_ = local_400._12_4_ * fVar218;
    auVar38._16_4_ = local_400._16_4_ * 0.0;
    auVar38._20_4_ = local_400._20_4_ * 0.0;
    auVar38._24_4_ = local_400._24_4_ * 0.0;
    auVar38._28_4_ = fVar243;
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar35,local_340);
    auVar104 = vfmadd231ps_avx512vl(auVar37,auVar35,local_360);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar35,local_380);
    auVar105 = vfmadd231ps_avx512vl(auVar38,local_3a0,auVar35);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar34,local_2c0);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar34,local_2e0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar34,local_300);
    auVar105 = vfmadd231ps_avx512vl(auVar105,local_320,auVar34);
    auVar106 = vfmadd231ps_avx512vl(auVar103,auVar33,local_240);
    auVar107 = vfmadd231ps_avx512vl(auVar104,auVar33,local_260);
    auVar108 = vfmadd231ps_avx512vl(auVar102,auVar33,local_280);
    auVar102 = vfmadd231ps_avx512vl(auVar105,local_2a0,auVar33);
    auVar103 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar104 = vxorps_avx512vl(auVar101,auVar103);
    auVar103 = vxorps_avx512vl(ZEXT1632(auVar89),auVar103);
    auVar236._0_4_ = auVar103._0_4_ * fVar251;
    auVar236._4_4_ = auVar103._4_4_ * fVar253;
    auVar236._8_4_ = auVar103._8_4_ * fVar245;
    auVar236._12_4_ = auVar103._12_4_ * fVar219;
    auVar236._16_4_ = auVar103._16_4_ * 0.0;
    auVar236._20_4_ = auVar103._20_4_ * 0.0;
    auVar236._24_4_ = auVar103._24_4_ * 0.0;
    auVar236._28_4_ = 0;
    auVar105 = vmulps_avx512vl(auVar229._0_32_,auVar100);
    auVar100 = vsubps_avx(auVar236,auVar105);
    auVar39._4_4_ = auVar104._4_4_ * fVar252 * 0.5;
    auVar39._0_4_ = auVar104._0_4_ * fVar249 * 0.5;
    auVar39._8_4_ = auVar104._8_4_ * fVar244 * 0.5;
    auVar39._12_4_ = auVar104._12_4_ * fVar254 * 0.5;
    auVar39._16_4_ = auVar104._16_4_ * fVar240 * 0.5;
    auVar39._20_4_ = auVar104._20_4_ * fVar255 * 0.5;
    auVar39._24_4_ = auVar104._24_4_ * fVar241 * 0.5;
    auVar39._28_4_ = auVar101._28_4_;
    auVar40._4_4_ = auVar100._4_4_ * 0.5;
    auVar40._0_4_ = auVar100._0_4_ * 0.5;
    auVar40._8_4_ = auVar100._8_4_ * 0.5;
    auVar40._12_4_ = auVar100._12_4_ * 0.5;
    auVar40._16_4_ = auVar100._16_4_ * 0.5;
    auVar40._20_4_ = auVar100._20_4_ * 0.5;
    auVar40._24_4_ = auVar100._24_4_ * 0.5;
    auVar40._28_4_ = auVar100._28_4_;
    auVar41._4_4_ = (fVar252 * fVar252 + auVar105._4_4_) * 0.5;
    auVar41._0_4_ = (fVar249 * fVar249 + auVar105._0_4_) * 0.5;
    auVar41._8_4_ = (fVar244 * fVar244 + auVar105._8_4_) * 0.5;
    auVar41._12_4_ = (fVar254 * fVar254 + auVar105._12_4_) * 0.5;
    auVar41._16_4_ = (fVar240 * fVar240 + auVar105._16_4_) * 0.5;
    auVar41._20_4_ = (fVar255 * fVar255 + auVar105._20_4_) * 0.5;
    auVar41._24_4_ = (fVar241 * fVar241 + auVar105._24_4_) * 0.5;
    auVar41._28_4_ = auVar248._28_4_ + auVar105._28_4_;
    fVar249 = fVar251 * fVar251 * 0.5;
    fVar251 = fVar253 * fVar253 * 0.5;
    fVar252 = fVar245 * fVar245 * 0.5;
    fVar253 = fVar219 * fVar219 * 0.5;
    auVar42._28_4_ = auVar250._28_4_;
    auVar42._0_28_ = ZEXT1628(CONCAT412(fVar253,CONCAT48(fVar252,CONCAT44(fVar251,fVar249))));
    auVar101 = vmulps_avx512vl(local_3c0,auVar42);
    auVar43._4_4_ = fVar251 * (float)local_1e0._4_4_;
    auVar43._0_4_ = fVar249 * (float)local_1e0._0_4_;
    auVar43._8_4_ = fVar252 * fStack_1d8;
    auVar43._12_4_ = fVar253 * fStack_1d4;
    auVar43._16_4_ = fStack_1d0 * 0.0;
    auVar43._20_4_ = fStack_1cc * 0.0;
    auVar43._24_4_ = fStack_1c8 * 0.0;
    auVar43._28_4_ = fVar32;
    auVar100 = vmulps_avx512vl(local_3e0,auVar42);
    auVar44._4_4_ = fVar251 * local_400._4_4_;
    auVar44._0_4_ = fVar249 * local_400._0_4_;
    auVar44._8_4_ = fVar252 * local_400._8_4_;
    auVar44._12_4_ = fVar253 * local_400._12_4_;
    auVar44._16_4_ = local_400._16_4_ * 0.0;
    auVar44._20_4_ = local_400._20_4_ * 0.0;
    auVar44._24_4_ = local_400._24_4_ * 0.0;
    auVar44._28_4_ = auVar250._28_4_;
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar41,local_340);
    auVar104 = vfmadd231ps_avx512vl(auVar43,auVar41,local_360);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar41,local_380);
    auVar105 = vfmadd231ps_avx512vl(auVar44,local_3a0,auVar41);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar40,local_2c0);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar40,local_2e0);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar40,local_300);
    auVar105 = vfmadd231ps_avx512vl(auVar105,local_320,auVar40);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar39,local_240);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar39,local_260);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar39,local_280);
    auVar105 = vfmadd231ps_avx512vl(auVar105,local_2a0,auVar39);
    auVar45._4_4_ = auVar101._4_4_ * fVar246;
    auVar45._0_4_ = auVar101._0_4_ * fVar246;
    auVar45._8_4_ = auVar101._8_4_ * fVar246;
    auVar45._12_4_ = auVar101._12_4_ * fVar246;
    auVar45._16_4_ = auVar101._16_4_ * fVar246;
    auVar45._20_4_ = auVar101._20_4_ * fVar246;
    auVar45._24_4_ = auVar101._24_4_ * fVar246;
    auVar45._28_4_ = auVar103._28_4_;
    auVar258 = ZEXT3264(auVar45);
    auVar46._4_4_ = auVar104._4_4_ * fVar246;
    auVar46._0_4_ = auVar104._0_4_ * fVar246;
    auVar46._8_4_ = auVar104._8_4_ * fVar246;
    auVar46._12_4_ = auVar104._12_4_ * fVar246;
    auVar46._16_4_ = auVar104._16_4_ * fVar246;
    auVar46._20_4_ = auVar104._20_4_ * fVar246;
    auVar46._24_4_ = auVar104._24_4_ * fVar246;
    auVar46._28_4_ = auVar104._28_4_;
    auVar262 = ZEXT3264(auVar46);
    auVar47._4_4_ = auVar100._4_4_ * fVar246;
    auVar47._0_4_ = auVar100._0_4_ * fVar246;
    auVar47._8_4_ = auVar100._8_4_ * fVar246;
    auVar47._12_4_ = auVar100._12_4_ * fVar246;
    auVar47._16_4_ = auVar100._16_4_ * fVar246;
    auVar47._20_4_ = auVar100._20_4_ * fVar246;
    auVar47._24_4_ = auVar100._24_4_ * fVar246;
    auVar47._28_4_ = auVar100._28_4_;
    auVar265 = ZEXT3264(auVar47);
    fVar249 = auVar105._0_4_ * fVar246;
    fVar251 = auVar105._4_4_ * fVar246;
    auVar48._4_4_ = fVar251;
    auVar48._0_4_ = fVar249;
    fVar252 = auVar105._8_4_ * fVar246;
    auVar48._8_4_ = fVar252;
    fVar253 = auVar105._12_4_ * fVar246;
    auVar48._12_4_ = fVar253;
    fVar244 = auVar105._16_4_ * fVar246;
    auVar48._16_4_ = fVar244;
    fVar245 = auVar105._20_4_ * fVar246;
    auVar48._20_4_ = fVar245;
    fVar246 = auVar105._24_4_ * fVar246;
    auVar48._24_4_ = fVar246;
    auVar48._28_4_ = local_400._28_4_;
    auVar89 = vxorps_avx512vl(local_3a0._0_16_,local_3a0._0_16_);
    auVar105 = vpermt2ps_avx512vl(auVar106,_DAT_0205fd20,ZEXT1632(auVar89));
    auVar248 = ZEXT3264(auVar105);
    auVar109 = vpermt2ps_avx512vl(auVar107,_DAT_0205fd20,ZEXT1632(auVar89));
    auVar250 = ZEXT3264(auVar109);
    auVar103 = ZEXT1632(auVar89);
    auVar98 = vpermt2ps_avx512vl(auVar108,_DAT_0205fd20,auVar103);
    auVar256 = ZEXT3264(auVar98);
    auVar237._0_4_ = fVar249 + auVar102._0_4_;
    auVar237._4_4_ = fVar251 + auVar102._4_4_;
    auVar237._8_4_ = fVar252 + auVar102._8_4_;
    auVar237._12_4_ = fVar253 + auVar102._12_4_;
    auVar237._16_4_ = fVar244 + auVar102._16_4_;
    auVar237._20_4_ = fVar245 + auVar102._20_4_;
    auVar237._24_4_ = fVar246 + auVar102._24_4_;
    auVar237._28_4_ = local_400._28_4_ + auVar102._28_4_;
    auVar101 = vmaxps_avx(auVar102,auVar237);
    auVar100 = vminps_avx(auVar102,auVar237);
    auVar99 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,auVar103);
    auVar110 = vpermt2ps_avx512vl(auVar45,_DAT_0205fd20,auVar103);
    auVar96 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar103);
    auVar130 = ZEXT1632(auVar89);
    auVar97 = vpermt2ps_avx512vl(auVar47,_DAT_0205fd20,auVar130);
    auVar102 = vpermt2ps_avx512vl(auVar48,_DAT_0205fd20,auVar130);
    auVar111 = vsubps_avx512vl(auVar99,auVar102);
    auVar102 = vsubps_avx(auVar105,auVar106);
    auVar103 = vsubps_avx(auVar109,auVar107);
    auVar104 = vsubps_avx(auVar98,auVar108);
    auVar242 = ZEXT3264(auVar104);
    auVar112 = vmulps_avx512vl(auVar103,auVar47);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar46,auVar104);
    auVar113 = vmulps_avx512vl(auVar104,auVar45);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar47,auVar102);
    auVar114 = vmulps_avx512vl(auVar102,auVar46);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar45,auVar103);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar113 = vmulps_avx512vl(auVar104,auVar104);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar103,auVar103);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar102,auVar102);
    auVar114 = vrcp14ps_avx512vl(auVar113);
    auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar116 = vfnmadd213ps_avx512vl(auVar114,auVar113,auVar115);
    auVar114 = vfmadd132ps_avx512vl(auVar116,auVar114,auVar114);
    auVar112 = vmulps_avx512vl(auVar112,auVar114);
    auVar116 = vmulps_avx512vl(auVar103,auVar97);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar96,auVar104);
    auVar117 = vmulps_avx512vl(auVar104,auVar110);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar97,auVar102);
    auVar118 = vmulps_avx512vl(auVar102,auVar96);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar110,auVar103);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar114 = vmulps_avx512vl(auVar116,auVar114);
    auVar112 = vmaxps_avx512vl(auVar112,auVar114);
    auVar112 = vsqrtps_avx512vl(auVar112);
    auVar114 = vmaxps_avx512vl(auVar111,auVar99);
    auVar101 = vmaxps_avx512vl(auVar101,auVar114);
    auVar114 = vaddps_avx512vl(auVar112,auVar101);
    auVar101 = vminps_avx512vl(auVar111,auVar99);
    auVar101 = vminps_avx(auVar100,auVar101);
    auVar101 = vsubps_avx512vl(auVar101,auVar112);
    auVar123._8_4_ = 0x3f800002;
    auVar123._0_8_ = 0x3f8000023f800002;
    auVar123._12_4_ = 0x3f800002;
    auVar123._16_4_ = 0x3f800002;
    auVar123._20_4_ = 0x3f800002;
    auVar123._24_4_ = 0x3f800002;
    auVar123._28_4_ = 0x3f800002;
    auVar100 = vmulps_avx512vl(auVar114,auVar123);
    auVar124._8_4_ = 0x3f7ffffc;
    auVar124._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar124._12_4_ = 0x3f7ffffc;
    auVar124._16_4_ = 0x3f7ffffc;
    auVar124._20_4_ = 0x3f7ffffc;
    auVar124._24_4_ = 0x3f7ffffc;
    auVar124._28_4_ = 0x3f7ffffc;
    auVar99 = vmulps_avx512vl(auVar101,auVar124);
    auVar49._4_4_ = auVar100._4_4_ * auVar100._4_4_;
    auVar49._0_4_ = auVar100._0_4_ * auVar100._0_4_;
    auVar49._8_4_ = auVar100._8_4_ * auVar100._8_4_;
    auVar49._12_4_ = auVar100._12_4_ * auVar100._12_4_;
    auVar49._16_4_ = auVar100._16_4_ * auVar100._16_4_;
    auVar49._20_4_ = auVar100._20_4_ * auVar100._20_4_;
    auVar49._24_4_ = auVar100._24_4_ * auVar100._24_4_;
    auVar49._28_4_ = auVar99._28_4_;
    auVar101 = vrsqrt14ps_avx512vl(auVar113);
    auVar127._8_4_ = 0xbf000000;
    auVar127._0_8_ = 0xbf000000bf000000;
    auVar127._12_4_ = 0xbf000000;
    auVar127._16_4_ = 0xbf000000;
    auVar127._20_4_ = 0xbf000000;
    auVar127._24_4_ = 0xbf000000;
    auVar127._28_4_ = 0xbf000000;
    auVar100 = vmulps_avx512vl(auVar113,auVar127);
    auVar50._4_4_ = auVar101._4_4_ * auVar100._4_4_;
    auVar50._0_4_ = auVar101._0_4_ * auVar100._0_4_;
    auVar50._8_4_ = auVar101._8_4_ * auVar100._8_4_;
    auVar50._12_4_ = auVar101._12_4_ * auVar100._12_4_;
    auVar50._16_4_ = auVar101._16_4_ * auVar100._16_4_;
    auVar50._20_4_ = auVar101._20_4_ * auVar100._20_4_;
    auVar50._24_4_ = auVar101._24_4_ * auVar100._24_4_;
    auVar50._28_4_ = auVar100._28_4_;
    auVar100 = vmulps_avx512vl(auVar101,auVar101);
    auVar100 = vmulps_avx512vl(auVar100,auVar50);
    auVar128._8_4_ = 0x3fc00000;
    auVar128._0_8_ = 0x3fc000003fc00000;
    auVar128._12_4_ = 0x3fc00000;
    auVar128._16_4_ = 0x3fc00000;
    auVar128._20_4_ = 0x3fc00000;
    auVar128._24_4_ = 0x3fc00000;
    auVar128._28_4_ = 0x3fc00000;
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar101,auVar128);
    auVar51._4_4_ = auVar100._4_4_ * auVar102._4_4_;
    auVar51._0_4_ = auVar100._0_4_ * auVar102._0_4_;
    auVar51._8_4_ = auVar100._8_4_ * auVar102._8_4_;
    auVar51._12_4_ = auVar100._12_4_ * auVar102._12_4_;
    auVar51._16_4_ = auVar100._16_4_ * auVar102._16_4_;
    auVar51._20_4_ = auVar100._20_4_ * auVar102._20_4_;
    auVar51._24_4_ = auVar100._24_4_ * auVar102._24_4_;
    auVar51._28_4_ = auVar101._28_4_;
    auVar101 = vmulps_avx512vl(auVar103,auVar100);
    auVar111 = vmulps_avx512vl(auVar104,auVar100);
    auVar112 = vsubps_avx512vl(auVar130,auVar106);
    auVar113 = vsubps_avx512vl(auVar130,auVar107);
    auVar114 = vsubps_avx512vl(auVar130,auVar108);
    auVar116 = vmulps_avx512vl(local_600,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_5e0,auVar113);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_5c0,auVar112);
    auVar117 = vmulps_avx512vl(auVar114,auVar114);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,auVar113);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar112,auVar112);
    auVar118 = vmulps_avx512vl(local_600,auVar111);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar101,local_5e0);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar51,local_5c0);
    auVar111 = vmulps_avx512vl(auVar114,auVar111);
    auVar101 = vfmadd231ps_avx512vl(auVar111,auVar113,auVar101);
    auVar111 = vfmadd231ps_avx512vl(auVar101,auVar112,auVar51);
    auVar119 = vmulps_avx512vl(auVar118,auVar118);
    auVar120 = vsubps_avx512vl(local_200,auVar119);
    auVar101 = vmulps_avx512vl(auVar118,auVar111);
    auVar101 = vsubps_avx512vl(auVar116,auVar101);
    auVar116 = vaddps_avx512vl(auVar101,auVar101);
    auVar101 = vmulps_avx512vl(auVar111,auVar111);
    local_8e0 = vsubps_avx512vl(auVar117,auVar101);
    auVar101 = vsubps_avx(local_8e0,auVar49);
    auVar117 = vmulps_avx512vl(auVar116,auVar116);
    auVar129._8_4_ = 0x40800000;
    auVar129._0_8_ = 0x4080000040800000;
    auVar129._12_4_ = 0x40800000;
    auVar129._16_4_ = 0x40800000;
    auVar129._20_4_ = 0x40800000;
    auVar129._24_4_ = 0x40800000;
    auVar129._28_4_ = 0x40800000;
    auVar121 = vmulps_avx512vl(auVar120,auVar129);
    auVar122 = vmulps_avx512vl(auVar121,auVar101);
    auVar122 = vsubps_avx512vl(auVar117,auVar122);
    uVar76 = vcmpps_avx512vl(auVar122,auVar130,5);
    bVar71 = (byte)uVar76;
    if (bVar71 == 0) {
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar122 = vsqrtps_avx512vl(auVar122);
      auVar123 = vaddps_avx512vl(auVar120,auVar120);
      auVar124 = vrcp14ps_avx512vl(auVar123);
      auVar123 = vfnmadd213ps_avx512vl(auVar123,auVar124,auVar115);
      auVar123 = vfmadd132ps_avx512vl(auVar123,auVar124,auVar124);
      auVar21._8_4_ = 0x80000000;
      auVar21._0_8_ = 0x8000000080000000;
      auVar21._12_4_ = 0x80000000;
      auVar21._16_4_ = 0x80000000;
      auVar21._20_4_ = 0x80000000;
      auVar21._24_4_ = 0x80000000;
      auVar21._28_4_ = 0x80000000;
      auVar124 = vxorps_avx512vl(auVar116,auVar21);
      auVar124 = vsubps_avx512vl(auVar124,auVar122);
      auVar124 = vmulps_avx512vl(auVar124,auVar123);
      auVar122 = vsubps_avx512vl(auVar122,auVar116);
      auVar122 = vmulps_avx512vl(auVar122,auVar123);
      auVar123 = vfmadd213ps_avx512vl(auVar118,auVar124,auVar111);
      local_6c0 = vmulps_avx512vl(auVar100,auVar123);
      auVar123 = vfmadd213ps_avx512vl(auVar118,auVar122,auVar111);
      local_6e0 = vmulps_avx512vl(auVar100,auVar123);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123 = vblendmps_avx512vl(auVar123,auVar124);
      auVar125._0_4_ =
           (uint)(bVar71 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar71 & 1) * local_6e0._0_4_;
      bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar84 * auVar123._4_4_ | (uint)!bVar84 * local_6e0._4_4_;
      bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar84 * auVar123._8_4_ | (uint)!bVar84 * local_6e0._8_4_;
      bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar84 * auVar123._12_4_ | (uint)!bVar84 * local_6e0._12_4_;
      bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar84 * auVar123._16_4_ | (uint)!bVar84 * local_6e0._16_4_;
      bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar84 * auVar123._20_4_ | (uint)!bVar84 * local_6e0._20_4_;
      bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar84 * auVar123._24_4_ | (uint)!bVar84 * local_6e0._24_4_;
      bVar84 = SUB81(uVar76 >> 7,0);
      auVar125._28_4_ = (uint)bVar84 * auVar123._28_4_ | (uint)!bVar84 * local_6e0._28_4_;
      auVar224._8_4_ = 0xff800000;
      auVar224._0_8_ = 0xff800000ff800000;
      auVar224._12_4_ = 0xff800000;
      auVar224._16_4_ = 0xff800000;
      auVar224._20_4_ = 0xff800000;
      auVar224._24_4_ = 0xff800000;
      auVar224._28_4_ = 0xff800000;
      auVar123 = vblendmps_avx512vl(auVar224,auVar122);
      auVar126._0_4_ =
           (uint)(bVar71 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar122._0_4_;
      bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar84 * auVar123._4_4_ | (uint)!bVar84 * auVar122._4_4_;
      bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar84 * auVar123._8_4_ | (uint)!bVar84 * auVar122._8_4_;
      bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar84 * auVar123._12_4_ | (uint)!bVar84 * auVar122._12_4_;
      bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar84 * auVar123._16_4_ | (uint)!bVar84 * auVar122._16_4_;
      bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar84 * auVar123._20_4_ | (uint)!bVar84 * auVar122._20_4_;
      bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar84 * auVar123._24_4_ | (uint)!bVar84 * auVar122._24_4_;
      bVar84 = SUB81(uVar76 >> 7,0);
      auVar126._28_4_ = (uint)bVar84 * auVar123._28_4_ | (uint)!bVar84 * auVar122._28_4_;
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar119,auVar122);
      auVar123 = vmaxps_avx512vl(local_620,auVar122);
      auVar22._8_4_ = 0x36000000;
      auVar22._0_8_ = 0x3600000036000000;
      auVar22._12_4_ = 0x36000000;
      auVar22._16_4_ = 0x36000000;
      auVar22._20_4_ = 0x36000000;
      auVar22._24_4_ = 0x36000000;
      auVar22._28_4_ = 0x36000000;
      auVar123 = vmulps_avx512vl(auVar123,auVar22);
      vandps_avx512vl(auVar120,auVar122);
      uVar75 = vcmpps_avx512vl(auVar123,auVar123,1);
      uVar76 = uVar76 & uVar75;
      bVar78 = (byte)uVar76;
      if (bVar78 != 0) {
        uVar75 = vcmpps_avx512vl(auVar101,_DAT_02020f00,2);
        auVar239._8_4_ = 0xff800000;
        auVar239._0_8_ = 0xff800000ff800000;
        auVar239._12_4_ = 0xff800000;
        auVar239._16_4_ = 0xff800000;
        auVar239._20_4_ = 0xff800000;
        auVar239._24_4_ = 0xff800000;
        auVar239._28_4_ = 0xff800000;
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar122 = vblendmps_avx512vl(auVar101,auVar239);
        bVar74 = (byte)uVar75;
        uVar86 = (uint)(bVar74 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar123._0_4_;
        bVar84 = (bool)((byte)(uVar75 >> 1) & 1);
        uVar146 = (uint)bVar84 * auVar122._4_4_ | (uint)!bVar84 * auVar123._4_4_;
        bVar84 = (bool)((byte)(uVar75 >> 2) & 1);
        uVar147 = (uint)bVar84 * auVar122._8_4_ | (uint)!bVar84 * auVar123._8_4_;
        bVar84 = (bool)((byte)(uVar75 >> 3) & 1);
        uVar148 = (uint)bVar84 * auVar122._12_4_ | (uint)!bVar84 * auVar123._12_4_;
        bVar84 = (bool)((byte)(uVar75 >> 4) & 1);
        uVar149 = (uint)bVar84 * auVar122._16_4_ | (uint)!bVar84 * auVar123._16_4_;
        bVar84 = (bool)((byte)(uVar75 >> 5) & 1);
        uVar150 = (uint)bVar84 * auVar122._20_4_ | (uint)!bVar84 * auVar123._20_4_;
        bVar84 = (bool)((byte)(uVar75 >> 6) & 1);
        uVar151 = (uint)bVar84 * auVar122._24_4_ | (uint)!bVar84 * auVar123._24_4_;
        bVar84 = SUB81(uVar75 >> 7,0);
        uVar152 = (uint)bVar84 * auVar122._28_4_ | (uint)!bVar84 * auVar123._28_4_;
        auVar125._0_4_ = (bVar78 & 1) * uVar86 | !(bool)(bVar78 & 1) * auVar125._0_4_;
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar125._4_4_ = bVar84 * uVar146 | !bVar84 * auVar125._4_4_;
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar125._8_4_ = bVar84 * uVar147 | !bVar84 * auVar125._8_4_;
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar125._12_4_ = bVar84 * uVar148 | !bVar84 * auVar125._12_4_;
        bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar125._16_4_ = bVar84 * uVar149 | !bVar84 * auVar125._16_4_;
        bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar125._20_4_ = bVar84 * uVar150 | !bVar84 * auVar125._20_4_;
        bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar125._24_4_ = bVar84 * uVar151 | !bVar84 * auVar125._24_4_;
        bVar84 = SUB81(uVar76 >> 7,0);
        auVar125._28_4_ = bVar84 * uVar152 | !bVar84 * auVar125._28_4_;
        auVar101 = vblendmps_avx512vl(auVar239,auVar101);
        bVar84 = (bool)((byte)(uVar75 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar75 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar75 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar75 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar75 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar75 >> 6) & 1);
        bVar12 = SUB81(uVar75 >> 7,0);
        auVar126._0_4_ =
             (uint)(bVar78 & 1) *
             ((uint)(bVar74 & 1) * auVar101._0_4_ | !(bool)(bVar74 & 1) * uVar86) |
             !(bool)(bVar78 & 1) * auVar126._0_4_;
        bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar126._4_4_ =
             (uint)bVar6 * ((uint)bVar84 * auVar101._4_4_ | !bVar84 * uVar146) |
             !bVar6 * auVar126._4_4_;
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar126._8_4_ =
             (uint)bVar84 * ((uint)bVar7 * auVar101._8_4_ | !bVar7 * uVar147) |
             !bVar84 * auVar126._8_4_;
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar126._12_4_ =
             (uint)bVar84 * ((uint)bVar8 * auVar101._12_4_ | !bVar8 * uVar148) |
             !bVar84 * auVar126._12_4_;
        bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar126._16_4_ =
             (uint)bVar84 * ((uint)bVar9 * auVar101._16_4_ | !bVar9 * uVar149) |
             !bVar84 * auVar126._16_4_;
        bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar126._20_4_ =
             (uint)bVar84 * ((uint)bVar10 * auVar101._20_4_ | !bVar10 * uVar150) |
             !bVar84 * auVar126._20_4_;
        bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar126._24_4_ =
             (uint)bVar84 * ((uint)bVar11 * auVar101._24_4_ | !bVar11 * uVar151) |
             !bVar84 * auVar126._24_4_;
        bVar84 = SUB81(uVar76 >> 7,0);
        auVar126._28_4_ =
             (uint)bVar84 * ((uint)bVar12 * auVar101._28_4_ | !bVar12 * uVar152) |
             !bVar84 * auVar126._28_4_;
        bVar71 = (~bVar78 | bVar74) & bVar71;
      }
      auVar115._8_4_ = 0x3f800000;
      auVar115._0_8_ = &DAT_3f8000003f800000;
      auVar115._12_4_ = 0x3f800000;
      auVar115._16_4_ = 0x3f800000;
      auVar115._20_4_ = 0x3f800000;
      auVar115._24_4_ = 0x3f800000;
      auVar115._28_4_ = 0x3f800000;
    }
    auVar229 = ZEXT3264(auVar115);
    if ((bVar71 & 0x7f) == 0) {
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar267 = ZEXT3264(auVar101);
      auVar215 = ZEXT1664(auVar198);
    }
    else {
      fVar249 = *(float *)(ray + k * 4 + 0x100) - (float)local_7d0._0_4_;
      auVar225._4_4_ = fVar249;
      auVar225._0_4_ = fVar249;
      auVar225._8_4_ = fVar249;
      auVar225._12_4_ = fVar249;
      auVar225._16_4_ = fVar249;
      auVar225._20_4_ = fVar249;
      auVar225._24_4_ = fVar249;
      auVar225._28_4_ = fVar249;
      auVar122 = vminps_avx512vl(auVar225,auVar126);
      auVar70._4_4_ = fStack_21c;
      auVar70._0_4_ = local_220;
      auVar70._8_4_ = fStack_218;
      auVar70._12_4_ = fStack_214;
      auVar70._16_4_ = fStack_210;
      auVar70._20_4_ = fStack_20c;
      auVar70._24_4_ = fStack_208;
      auVar70._28_4_ = fStack_204;
      auVar101 = vmaxps_avx512vl(auVar70,auVar125);
      auVar114 = vmulps_avx512vl(auVar47,auVar114);
      auVar113 = vfmadd213ps_avx512vl(auVar113,auVar46,auVar114);
      auVar112 = vfmadd213ps_avx512vl(auVar112,auVar45,auVar113);
      auVar113 = vmulps_avx512vl(local_600,auVar47);
      auVar113 = vfmadd231ps_avx512vl(auVar113,local_5e0,auVar46);
      auVar113 = vfmadd231ps_avx512vl(auVar113,local_5c0,auVar45);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar267 = ZEXT3264(auVar114);
      vandps_avx512vl(auVar113,auVar114);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar114,auVar123,1);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar112 = vxorps_avx512vl(auVar112,auVar124);
      auVar127 = vrcp14ps_avx512vl(auVar113);
      auVar128 = vxorps_avx512vl(auVar113,auVar124);
      auVar129 = vfnmadd213ps_avx512vl(auVar127,auVar113,auVar115);
      auVar129 = vfmadd132ps_avx512vl(auVar129,auVar127,auVar127);
      auVar112 = vmulps_avx512vl(auVar129,auVar112);
      uVar17 = vcmpps_avx512vl(auVar113,auVar128,1);
      bVar78 = (byte)uVar15 | (byte)uVar17;
      auVar129 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar130 = vblendmps_avx512vl(auVar112,auVar129);
      auVar131._0_4_ =
           (uint)(bVar78 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar127._0_4_;
      bVar84 = (bool)(bVar78 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar84 * auVar130._4_4_ | (uint)!bVar84 * auVar127._4_4_;
      bVar84 = (bool)(bVar78 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar84 * auVar130._8_4_ | (uint)!bVar84 * auVar127._8_4_;
      bVar84 = (bool)(bVar78 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar84 * auVar130._12_4_ | (uint)!bVar84 * auVar127._12_4_;
      bVar84 = (bool)(bVar78 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar84 * auVar130._16_4_ | (uint)!bVar84 * auVar127._16_4_;
      bVar84 = (bool)(bVar78 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar84 * auVar130._20_4_ | (uint)!bVar84 * auVar127._20_4_;
      bVar84 = (bool)(bVar78 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar84 * auVar130._24_4_ | (uint)!bVar84 * auVar127._24_4_;
      auVar131._28_4_ =
           (uint)(bVar78 >> 7) * auVar130._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar127._28_4_;
      auVar101 = vmaxps_avx(auVar101,auVar131);
      uVar17 = vcmpps_avx512vl(auVar113,auVar128,6);
      bVar78 = (byte)uVar15 | (byte)uVar17;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar132._0_4_ =
           (uint)(bVar78 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar112._0_4_;
      bVar84 = (bool)(bVar78 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar84 * auVar113._4_4_ | (uint)!bVar84 * auVar112._4_4_;
      bVar84 = (bool)(bVar78 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar84 * auVar113._8_4_ | (uint)!bVar84 * auVar112._8_4_;
      bVar84 = (bool)(bVar78 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar84 * auVar113._12_4_ | (uint)!bVar84 * auVar112._12_4_;
      bVar84 = (bool)(bVar78 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar84 * auVar113._16_4_ | (uint)!bVar84 * auVar112._16_4_;
      bVar84 = (bool)(bVar78 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar84 * auVar113._20_4_ | (uint)!bVar84 * auVar112._20_4_;
      bVar84 = (bool)(bVar78 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar84 * auVar113._24_4_ | (uint)!bVar84 * auVar112._24_4_;
      auVar132._28_4_ =
           (uint)(bVar78 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar112._28_4_;
      auVar112 = vminps_avx(auVar122,auVar132);
      auVar265 = ZEXT864(0) << 0x20;
      auVar105 = vsubps_avx(ZEXT832(0) << 0x20,auVar105);
      auVar109 = vsubps_avx(ZEXT832(0) << 0x20,auVar109);
      auVar122 = ZEXT832(0) << 0x20;
      auVar98 = vsubps_avx(auVar122,auVar98);
      auVar52._4_4_ = auVar98._4_4_ * auVar97._4_4_;
      auVar52._0_4_ = auVar98._0_4_ * auVar97._0_4_;
      auVar52._8_4_ = auVar98._8_4_ * auVar97._8_4_;
      auVar52._12_4_ = auVar98._12_4_ * auVar97._12_4_;
      auVar52._16_4_ = auVar98._16_4_ * auVar97._16_4_;
      auVar52._20_4_ = auVar98._20_4_ * auVar97._20_4_;
      auVar52._24_4_ = auVar98._24_4_ * auVar97._24_4_;
      auVar52._28_4_ = auVar98._28_4_;
      auVar109 = vfnmsub231ps_avx512vl(auVar52,auVar96,auVar109);
      auVar105 = vfnmadd231ps_avx512vl(auVar109,auVar110,auVar105);
      auVar109 = vmulps_avx512vl(local_600,auVar97);
      auVar109 = vfnmsub231ps_avx512vl(auVar109,local_5e0,auVar96);
      auVar109 = vfnmadd231ps_avx512vl(auVar109,local_5c0,auVar110);
      vandps_avx512vl(auVar109,auVar114);
      uVar15 = vcmpps_avx512vl(auVar109,auVar123,1);
      auVar105 = vxorps_avx512vl(auVar105,auVar124);
      auVar98 = vrcp14ps_avx512vl(auVar109);
      auVar110 = vxorps_avx512vl(auVar109,auVar124);
      auVar258 = ZEXT3264(auVar110);
      auVar97 = vfnmadd213ps_avx512vl(auVar98,auVar109,auVar115);
      auVar89 = vfmadd132ps_fma(auVar97,auVar98,auVar98);
      auVar262 = ZEXT1664(auVar89);
      fVar249 = auVar89._0_4_ * auVar105._0_4_;
      fVar251 = auVar89._4_4_ * auVar105._4_4_;
      auVar53._4_4_ = fVar251;
      auVar53._0_4_ = fVar249;
      fVar252 = auVar89._8_4_ * auVar105._8_4_;
      auVar53._8_4_ = fVar252;
      fVar253 = auVar89._12_4_ * auVar105._12_4_;
      auVar53._12_4_ = fVar253;
      fVar244 = auVar105._16_4_ * 0.0;
      auVar53._16_4_ = fVar244;
      fVar245 = auVar105._20_4_ * 0.0;
      auVar53._20_4_ = fVar245;
      fVar254 = auVar105._24_4_ * 0.0;
      auVar53._24_4_ = fVar254;
      auVar53._28_4_ = auVar105._28_4_;
      uVar17 = vcmpps_avx512vl(auVar109,auVar110,1);
      bVar78 = (byte)uVar15 | (byte)uVar17;
      auVar97 = vblendmps_avx512vl(auVar53,auVar129);
      auVar133._0_4_ =
           (uint)(bVar78 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar98._0_4_;
      bVar84 = (bool)(bVar78 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar84 * auVar97._4_4_ | (uint)!bVar84 * auVar98._4_4_;
      bVar84 = (bool)(bVar78 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar84 * auVar97._8_4_ | (uint)!bVar84 * auVar98._8_4_;
      bVar84 = (bool)(bVar78 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar84 * auVar97._12_4_ | (uint)!bVar84 * auVar98._12_4_;
      bVar84 = (bool)(bVar78 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar84 * auVar97._16_4_ | (uint)!bVar84 * auVar98._16_4_;
      bVar84 = (bool)(bVar78 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar84 * auVar97._20_4_ | (uint)!bVar84 * auVar98._20_4_;
      bVar84 = (bool)(bVar78 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar84 * auVar97._24_4_ | (uint)!bVar84 * auVar98._24_4_;
      auVar133._28_4_ =
           (uint)(bVar78 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar98._28_4_;
      auVar256 = ZEXT3264(auVar133);
      _local_760 = vmaxps_avx(auVar101,auVar133);
      uVar17 = vcmpps_avx512vl(auVar109,auVar110,6);
      bVar78 = (byte)uVar15 | (byte)uVar17;
      auVar134._0_4_ =
           (uint)(bVar78 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar78 & 1) * (int)fVar249;
      bVar84 = (bool)(bVar78 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar84 * auVar113._4_4_ | (uint)!bVar84 * (int)fVar251;
      bVar84 = (bool)(bVar78 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar84 * auVar113._8_4_ | (uint)!bVar84 * (int)fVar252;
      bVar84 = (bool)(bVar78 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar84 * auVar113._12_4_ | (uint)!bVar84 * (int)fVar253;
      bVar84 = (bool)(bVar78 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar84 * auVar113._16_4_ | (uint)!bVar84 * (int)fVar244;
      bVar84 = (bool)(bVar78 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar84 * auVar113._20_4_ | (uint)!bVar84 * (int)fVar245;
      bVar84 = (bool)(bVar78 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar84 * auVar113._24_4_ | (uint)!bVar84 * (int)fVar254;
      auVar134._28_4_ =
           (uint)(bVar78 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar105._28_4_;
      auVar250 = ZEXT3264(auVar134);
      local_460 = vminps_avx(auVar112,auVar134);
      auVar248 = ZEXT3264(local_460);
      uVar15 = vcmpps_avx512vl(_local_760,local_460,2);
      bVar71 = bVar71 & 0x7f & (byte)uVar15;
      if (bVar71 == 0) {
        auVar229 = ZEXT3264(auVar115);
        auVar215 = ZEXT1664(auVar198);
      }
      else {
        auVar101 = vmaxps_avx(auVar122,auVar99);
        auVar105 = vminps_avx512vl(local_6c0,auVar115);
        auVar59 = ZEXT412(0);
        auVar256 = ZEXT1264(auVar59) << 0x20;
        auVar105 = vmaxps_avx(auVar105,ZEXT1232(auVar59) << 0x20);
        auVar109 = vminps_avx512vl(local_6e0,auVar115);
        auVar262 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar54._4_4_ = (auVar105._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar105._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar105._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar105._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar105._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar105._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar105._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar105._28_4_ + 7.0;
        local_6c0 = vfmadd213ps_avx512vl(auVar54,local_8c0,auVar235);
        auVar105 = vmaxps_avx(auVar109,ZEXT1232(auVar59) << 0x20);
        auVar55._4_4_ = (auVar105._4_4_ + 1.0) * 0.125;
        auVar55._0_4_ = (auVar105._0_4_ + 0.0) * 0.125;
        auVar55._8_4_ = (auVar105._8_4_ + 2.0) * 0.125;
        auVar55._12_4_ = (auVar105._12_4_ + 3.0) * 0.125;
        auVar55._16_4_ = (auVar105._16_4_ + 4.0) * 0.125;
        auVar55._20_4_ = (auVar105._20_4_ + 5.0) * 0.125;
        auVar55._24_4_ = (auVar105._24_4_ + 6.0) * 0.125;
        auVar55._28_4_ = auVar105._28_4_ + 7.0;
        local_6e0 = vfmadd213ps_avx512vl(auVar55,local_8c0,auVar235);
        auVar56._4_4_ = auVar101._4_4_ * auVar101._4_4_;
        auVar56._0_4_ = auVar101._0_4_ * auVar101._0_4_;
        auVar56._8_4_ = auVar101._8_4_ * auVar101._8_4_;
        auVar56._12_4_ = auVar101._12_4_ * auVar101._12_4_;
        auVar56._16_4_ = auVar101._16_4_ * auVar101._16_4_;
        auVar56._20_4_ = auVar101._20_4_ * auVar101._20_4_;
        auVar56._24_4_ = auVar101._24_4_ * auVar101._24_4_;
        auVar56._28_4_ = local_6e0._28_4_;
        auVar101 = vsubps_avx(local_8e0,auVar56);
        auVar258 = ZEXT3264(auVar101);
        auVar105 = vmulps_avx512vl(auVar121,auVar101);
        auVar105 = vsubps_avx512vl(auVar117,auVar105);
        uVar15 = vcmpps_avx512vl(auVar105,ZEXT1232(auVar59) << 0x20,5);
        bVar78 = (byte)uVar15;
        if (bVar78 == 0) {
          auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar105 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar109 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar250 = ZEXT864(0) << 0x20;
          auVar135._8_4_ = 0x7f800000;
          auVar135._0_8_ = 0x7f8000007f800000;
          auVar135._12_4_ = 0x7f800000;
          auVar135._16_4_ = 0x7f800000;
          auVar135._20_4_ = 0x7f800000;
          auVar135._24_4_ = 0x7f800000;
          auVar135._28_4_ = 0x7f800000;
          auVar136._8_4_ = 0xff800000;
          auVar136._0_8_ = 0xff800000ff800000;
          auVar136._12_4_ = 0xff800000;
          auVar136._16_4_ = 0xff800000;
          auVar136._20_4_ = 0xff800000;
          auVar136._24_4_ = 0xff800000;
          auVar136._28_4_ = 0xff800000;
        }
        else {
          auVar87 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
          uVar76 = vcmpps_avx512vl(auVar105,auVar122,5);
          auVar105 = vsqrtps_avx(auVar105);
          auVar238._0_4_ = auVar120._0_4_ + auVar120._0_4_;
          auVar238._4_4_ = auVar120._4_4_ + auVar120._4_4_;
          auVar238._8_4_ = auVar120._8_4_ + auVar120._8_4_;
          auVar238._12_4_ = auVar120._12_4_ + auVar120._12_4_;
          auVar238._16_4_ = auVar120._16_4_ + auVar120._16_4_;
          auVar238._20_4_ = auVar120._20_4_ + auVar120._20_4_;
          auVar238._24_4_ = auVar120._24_4_ + auVar120._24_4_;
          auVar238._28_4_ = auVar120._28_4_ + auVar120._28_4_;
          auVar109 = vrcp14ps_avx512vl(auVar238);
          auVar98 = vfnmadd213ps_avx512vl(auVar238,auVar109,auVar115);
          auVar89 = vfmadd132ps_fma(auVar98,auVar109,auVar109);
          auVar23._8_4_ = 0x80000000;
          auVar23._0_8_ = 0x8000000080000000;
          auVar23._12_4_ = 0x80000000;
          auVar23._16_4_ = 0x80000000;
          auVar23._20_4_ = 0x80000000;
          auVar23._24_4_ = 0x80000000;
          auVar23._28_4_ = 0x80000000;
          auVar109 = vxorps_avx512vl(auVar116,auVar23);
          auVar109 = vsubps_avx(auVar109,auVar105);
          auVar57._4_4_ = auVar109._4_4_ * auVar89._4_4_;
          auVar57._0_4_ = auVar109._0_4_ * auVar89._0_4_;
          auVar57._8_4_ = auVar109._8_4_ * auVar89._8_4_;
          auVar57._12_4_ = auVar109._12_4_ * auVar89._12_4_;
          auVar57._16_4_ = auVar109._16_4_ * 0.0;
          auVar57._20_4_ = auVar109._20_4_ * 0.0;
          auVar57._24_4_ = auVar109._24_4_ * 0.0;
          auVar57._28_4_ = 0x3e000000;
          auVar262 = ZEXT3264(auVar57);
          auVar105 = vsubps_avx512vl(auVar105,auVar116);
          auVar264._0_4_ = auVar105._0_4_ * auVar89._0_4_;
          auVar264._4_4_ = auVar105._4_4_ * auVar89._4_4_;
          auVar264._8_4_ = auVar105._8_4_ * auVar89._8_4_;
          auVar264._12_4_ = auVar105._12_4_ * auVar89._12_4_;
          auVar264._16_4_ = auVar105._16_4_ * 0.0;
          auVar264._20_4_ = auVar105._20_4_ * 0.0;
          auVar264._24_4_ = auVar105._24_4_ * 0.0;
          auVar264._28_4_ = 0;
          auVar265 = ZEXT3264(auVar264);
          auVar105 = vfmadd213ps_avx512vl(auVar118,auVar57,auVar111);
          auVar58._4_4_ = auVar100._4_4_ * auVar105._4_4_;
          auVar58._0_4_ = auVar100._0_4_ * auVar105._0_4_;
          auVar58._8_4_ = auVar100._8_4_ * auVar105._8_4_;
          auVar58._12_4_ = auVar100._12_4_ * auVar105._12_4_;
          auVar58._16_4_ = auVar100._16_4_ * auVar105._16_4_;
          auVar58._20_4_ = auVar100._20_4_ * auVar105._20_4_;
          auVar58._24_4_ = auVar100._24_4_ * auVar105._24_4_;
          auVar58._28_4_ = auVar109._28_4_;
          auVar105 = vmulps_avx512vl(local_5c0,auVar57);
          auVar109 = vmulps_avx512vl(local_5e0,auVar57);
          auVar98 = vmulps_avx512vl(local_600,auVar57);
          auVar99 = vfmadd213ps_avx512vl(auVar102,auVar58,auVar106);
          auVar105 = vsubps_avx512vl(auVar105,auVar99);
          auVar99 = vfmadd213ps_avx512vl(auVar103,auVar58,auVar107);
          auVar109 = vsubps_avx512vl(auVar109,auVar99);
          auVar89 = vfmadd213ps_fma(auVar58,auVar104,auVar108);
          auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar89));
          auVar250 = ZEXT3264(auVar98);
          auVar98 = vfmadd213ps_avx512vl(auVar118,auVar264,auVar111);
          auVar98 = vmulps_avx512vl(auVar100,auVar98);
          auVar100 = vmulps_avx512vl(local_5c0,auVar264);
          auVar99 = vmulps_avx512vl(local_5e0,auVar264);
          auVar110 = vmulps_avx512vl(local_600,auVar264);
          auVar89 = vfmadd213ps_fma(auVar102,auVar98,auVar106);
          auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar89));
          auVar256 = ZEXT3264(auVar100);
          auVar89 = vfmadd213ps_fma(auVar103,auVar98,auVar107);
          auVar100 = vsubps_avx512vl(auVar99,ZEXT1632(auVar89));
          auVar89 = vfmadd213ps_fma(auVar104,auVar98,auVar108);
          auVar102 = vsubps_avx512vl(auVar110,ZEXT1632(auVar89));
          auVar164._8_4_ = 0x7f800000;
          auVar164._0_8_ = 0x7f8000007f800000;
          auVar164._12_4_ = 0x7f800000;
          auVar164._16_4_ = 0x7f800000;
          auVar164._20_4_ = 0x7f800000;
          auVar164._24_4_ = 0x7f800000;
          auVar164._28_4_ = 0x7f800000;
          auVar103 = vblendmps_avx512vl(auVar164,auVar57);
          bVar84 = (bool)((byte)uVar76 & 1);
          auVar135._0_4_ = (uint)bVar84 * auVar103._0_4_ | (uint)!bVar84 * auVar106._0_4_;
          bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar135._4_4_ = (uint)bVar84 * auVar103._4_4_ | (uint)!bVar84 * auVar106._4_4_;
          bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar135._8_4_ = (uint)bVar84 * auVar103._8_4_ | (uint)!bVar84 * auVar106._8_4_;
          bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar135._12_4_ = (uint)bVar84 * auVar103._12_4_ | (uint)!bVar84 * auVar106._12_4_;
          bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar135._16_4_ = (uint)bVar84 * auVar103._16_4_ | (uint)!bVar84 * auVar106._16_4_;
          bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar135._20_4_ = (uint)bVar84 * auVar103._20_4_ | (uint)!bVar84 * auVar106._20_4_;
          bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar135._24_4_ = (uint)bVar84 * auVar103._24_4_ | (uint)!bVar84 * auVar106._24_4_;
          bVar84 = SUB81(uVar76 >> 7,0);
          auVar135._28_4_ = (uint)bVar84 * auVar103._28_4_ | (uint)!bVar84 * auVar106._28_4_;
          auVar165._8_4_ = 0xff800000;
          auVar165._0_8_ = 0xff800000ff800000;
          auVar165._12_4_ = 0xff800000;
          auVar165._16_4_ = 0xff800000;
          auVar165._20_4_ = 0xff800000;
          auVar165._24_4_ = 0xff800000;
          auVar165._28_4_ = 0xff800000;
          auVar103 = vblendmps_avx512vl(auVar165,auVar264);
          bVar84 = (bool)((byte)uVar76 & 1);
          auVar136._0_4_ = (uint)bVar84 * auVar103._0_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar84 * auVar103._4_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar84 * auVar103._8_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar84 * auVar103._12_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar136._16_4_ = (uint)bVar84 * auVar103._16_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar136._20_4_ = (uint)bVar84 * auVar103._20_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar136._24_4_ = (uint)bVar84 * auVar103._24_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = SUB81(uVar76 >> 7,0);
          auVar136._28_4_ = (uint)bVar84 * auVar103._28_4_ | (uint)!bVar84 * -0x800000;
          vandps_avx512vl(auVar114,auVar119);
          auVar103 = vmaxps_avx(local_620,auVar136);
          auVar24._8_4_ = 0x36000000;
          auVar24._0_8_ = 0x3600000036000000;
          auVar24._12_4_ = 0x36000000;
          auVar24._16_4_ = 0x36000000;
          auVar24._20_4_ = 0x36000000;
          auVar24._24_4_ = 0x36000000;
          auVar24._28_4_ = 0x36000000;
          auVar103 = vmulps_avx512vl(auVar103,auVar24);
          vandps_avx512vl(auVar120,auVar114);
          uVar75 = vcmpps_avx512vl(auVar103,auVar103,1);
          uVar76 = uVar76 & uVar75;
          bVar74 = (byte)uVar76;
          if (bVar74 != 0) {
            uVar75 = vcmpps_avx512vl(auVar101,ZEXT1632(auVar87),2);
            auVar247._8_4_ = 0xff800000;
            auVar247._0_8_ = 0xff800000ff800000;
            auVar247._12_4_ = 0xff800000;
            auVar247._16_4_ = 0xff800000;
            auVar247._20_4_ = 0xff800000;
            auVar247._24_4_ = 0xff800000;
            auVar247._28_4_ = 0xff800000;
            auVar257._8_4_ = 0x7f800000;
            auVar257._0_8_ = 0x7f8000007f800000;
            auVar257._12_4_ = 0x7f800000;
            auVar257._16_4_ = 0x7f800000;
            auVar257._20_4_ = 0x7f800000;
            auVar257._24_4_ = 0x7f800000;
            auVar257._28_4_ = 0x7f800000;
            auVar258 = ZEXT3264(auVar257);
            auVar101 = vblendmps_avx512vl(auVar257,auVar247);
            bVar77 = (byte)uVar75;
            uVar86 = (uint)(bVar77 & 1) * auVar101._0_4_ |
                     (uint)!(bool)(bVar77 & 1) * auVar103._0_4_;
            bVar84 = (bool)((byte)(uVar75 >> 1) & 1);
            uVar146 = (uint)bVar84 * auVar101._4_4_ | (uint)!bVar84 * auVar103._4_4_;
            bVar84 = (bool)((byte)(uVar75 >> 2) & 1);
            uVar147 = (uint)bVar84 * auVar101._8_4_ | (uint)!bVar84 * auVar103._8_4_;
            bVar84 = (bool)((byte)(uVar75 >> 3) & 1);
            uVar148 = (uint)bVar84 * auVar101._12_4_ | (uint)!bVar84 * auVar103._12_4_;
            bVar84 = (bool)((byte)(uVar75 >> 4) & 1);
            uVar149 = (uint)bVar84 * auVar101._16_4_ | (uint)!bVar84 * auVar103._16_4_;
            bVar84 = (bool)((byte)(uVar75 >> 5) & 1);
            uVar150 = (uint)bVar84 * auVar101._20_4_ | (uint)!bVar84 * auVar103._20_4_;
            bVar84 = (bool)((byte)(uVar75 >> 6) & 1);
            uVar151 = (uint)bVar84 * auVar101._24_4_ | (uint)!bVar84 * auVar103._24_4_;
            bVar84 = SUB81(uVar75 >> 7,0);
            uVar152 = (uint)bVar84 * auVar101._28_4_ | (uint)!bVar84 * auVar103._28_4_;
            auVar135._0_4_ = (bVar74 & 1) * uVar86 | !(bool)(bVar74 & 1) * auVar135._0_4_;
            bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar135._4_4_ = bVar84 * uVar146 | !bVar84 * auVar135._4_4_;
            bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar135._8_4_ = bVar84 * uVar147 | !bVar84 * auVar135._8_4_;
            bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar135._12_4_ = bVar84 * uVar148 | !bVar84 * auVar135._12_4_;
            bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar135._16_4_ = bVar84 * uVar149 | !bVar84 * auVar135._16_4_;
            bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar135._20_4_ = bVar84 * uVar150 | !bVar84 * auVar135._20_4_;
            bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar135._24_4_ = bVar84 * uVar151 | !bVar84 * auVar135._24_4_;
            bVar84 = SUB81(uVar76 >> 7,0);
            auVar135._28_4_ = bVar84 * uVar152 | !bVar84 * auVar135._28_4_;
            auVar101 = vblendmps_avx512vl(auVar247,auVar257);
            bVar84 = (bool)((byte)(uVar75 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar75 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar75 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar75 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar75 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar75 >> 6) & 1);
            bVar12 = SUB81(uVar75 >> 7,0);
            auVar136._0_4_ =
                 (uint)(bVar74 & 1) *
                 ((uint)(bVar77 & 1) * auVar101._0_4_ | !(bool)(bVar77 & 1) * uVar86) |
                 !(bool)(bVar74 & 1) * auVar136._0_4_;
            bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar136._4_4_ =
                 (uint)bVar6 * ((uint)bVar84 * auVar101._4_4_ | !bVar84 * uVar146) |
                 !bVar6 * auVar136._4_4_;
            bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar136._8_4_ =
                 (uint)bVar84 * ((uint)bVar7 * auVar101._8_4_ | !bVar7 * uVar147) |
                 !bVar84 * auVar136._8_4_;
            bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar136._12_4_ =
                 (uint)bVar84 * ((uint)bVar8 * auVar101._12_4_ | !bVar8 * uVar148) |
                 !bVar84 * auVar136._12_4_;
            bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar136._16_4_ =
                 (uint)bVar84 * ((uint)bVar9 * auVar101._16_4_ | !bVar9 * uVar149) |
                 !bVar84 * auVar136._16_4_;
            bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar136._20_4_ =
                 (uint)bVar84 * ((uint)bVar10 * auVar101._20_4_ | !bVar10 * uVar150) |
                 !bVar84 * auVar136._20_4_;
            bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar136._24_4_ =
                 (uint)bVar84 * ((uint)bVar11 * auVar101._24_4_ | !bVar11 * uVar151) |
                 !bVar84 * auVar136._24_4_;
            bVar84 = SUB81(uVar76 >> 7,0);
            auVar136._28_4_ =
                 (uint)bVar84 * ((uint)bVar12 * auVar101._28_4_ | !bVar12 * uVar152) |
                 !bVar84 * auVar136._28_4_;
            bVar78 = (~bVar74 | bVar77) & bVar78;
          }
        }
        auVar101 = vmulps_avx512vl(local_600,auVar102);
        auVar101 = vfmadd231ps_avx512vl(auVar101,local_5e0,auVar100);
        auVar101 = vfmadd231ps_avx512vl(auVar101,local_5c0,auVar256._0_32_);
        _local_1c0 = _local_760;
        local_1a0 = vminps_avx(local_460,auVar135);
        vandps_avx512vl(auVar101,auVar114);
        _local_720 = vmaxps_avx(_local_760,auVar136);
        auVar242 = ZEXT3264(_local_720);
        _local_480 = _local_720;
        auVar166._8_4_ = 0x3e99999a;
        auVar166._0_8_ = 0x3e99999a3e99999a;
        auVar166._12_4_ = 0x3e99999a;
        auVar166._16_4_ = 0x3e99999a;
        auVar166._20_4_ = 0x3e99999a;
        auVar166._24_4_ = 0x3e99999a;
        auVar166._28_4_ = 0x3e99999a;
        uVar15 = vcmpps_avx512vl(auVar101,auVar166,1);
        uVar17 = vcmpps_avx512vl(_local_760,local_1a0,2);
        bVar74 = (byte)uVar17 & bVar71;
        uVar16 = vcmpps_avx512vl(_local_720,local_460,2);
        if ((bVar71 & ((byte)uVar16 | (byte)uVar17)) == 0) {
          auVar229 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar215 = ZEXT1664(auVar198);
        }
        else {
          auVar101 = vmulps_avx512vl(local_600,auVar250._0_32_);
          auVar101 = vfmadd213ps_avx512vl(auVar109,local_5e0,auVar101);
          auVar101 = vfmadd213ps_avx512vl(auVar105,local_5c0,auVar101);
          vandps_avx512vl(auVar101,auVar114);
          uVar17 = vcmpps_avx512vl(auVar101,auVar166,1);
          bVar77 = (byte)uVar17 | ~bVar78;
          auVar167._8_4_ = 2;
          auVar167._0_8_ = 0x200000002;
          auVar167._12_4_ = 2;
          auVar167._16_4_ = 2;
          auVar167._20_4_ = 2;
          auVar167._24_4_ = 2;
          auVar167._28_4_ = 2;
          auVar25._8_4_ = 3;
          auVar25._0_8_ = 0x300000003;
          auVar25._12_4_ = 3;
          auVar25._16_4_ = 3;
          auVar25._20_4_ = 3;
          auVar25._24_4_ = 3;
          auVar25._28_4_ = 3;
          auVar101 = vpblendmd_avx512vl(auVar167,auVar25);
          local_440._0_4_ = (uint)(bVar77 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar77 & 1) * 2;
          bVar84 = (bool)(bVar77 >> 1 & 1);
          local_440._4_4_ = (uint)bVar84 * auVar101._4_4_ | (uint)!bVar84 * 2;
          bVar84 = (bool)(bVar77 >> 2 & 1);
          local_440._8_4_ = (uint)bVar84 * auVar101._8_4_ | (uint)!bVar84 * 2;
          bVar84 = (bool)(bVar77 >> 3 & 1);
          local_440._12_4_ = (uint)bVar84 * auVar101._12_4_ | (uint)!bVar84 * 2;
          bVar84 = (bool)(bVar77 >> 4 & 1);
          local_440._16_4_ = (uint)bVar84 * auVar101._16_4_ | (uint)!bVar84 * 2;
          bVar84 = (bool)(bVar77 >> 5 & 1);
          local_440._20_4_ = (uint)bVar84 * auVar101._20_4_ | (uint)!bVar84 * 2;
          bVar84 = (bool)(bVar77 >> 6 & 1);
          local_440._24_4_ = (uint)bVar84 * auVar101._24_4_ | (uint)!bVar84 * 2;
          local_440._28_4_ = (uint)(bVar77 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar77 >> 7) * 2;
          local_640 = vpbroadcastd_avx512vl();
          uVar17 = vpcmpd_avx512vl(local_640,local_440,5);
          bVar77 = (byte)uVar17 & bVar74;
          if (bVar77 == 0) {
            auVar232._8_4_ = 0x7fffffff;
            auVar232._0_8_ = 0x7fffffff7fffffff;
            auVar232._12_4_ = 0x7fffffff;
          }
          else {
            auVar87 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar89 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar1 = vminps_avx(local_840._0_16_,local_880._0_16_);
            auVar90 = vminps_avx(auVar87,auVar1);
            auVar87 = vmaxps_avx(local_840._0_16_,local_880._0_16_);
            auVar1 = vmaxps_avx(auVar89,auVar87);
            auVar199._8_4_ = 0x7fffffff;
            auVar199._0_8_ = 0x7fffffff7fffffff;
            auVar199._12_4_ = 0x7fffffff;
            auVar89 = vandps_avx(auVar90,auVar199);
            auVar87 = vandps_avx(auVar1,auVar199);
            auVar89 = vmaxps_avx(auVar89,auVar87);
            auVar87 = vmovshdup_avx(auVar89);
            auVar87 = vmaxss_avx(auVar87,auVar89);
            auVar89 = vshufpd_avx(auVar89,auVar89,1);
            auVar89 = vmaxss_avx(auVar89,auVar87);
            fVar249 = auVar89._0_4_ * 1.9073486e-06;
            local_7e0 = vshufps_avx(auVar1,auVar1,0xff);
            local_700 = (float)local_760._0_4_ + (float)local_740._0_4_;
            fStack_6fc = (float)local_760._4_4_ + (float)local_740._4_4_;
            fStack_6f8 = fStack_758 + fStack_738;
            fStack_6f4 = fStack_754 + fStack_734;
            fStack_6f0 = fStack_750 + fStack_730;
            fStack_6ec = fStack_74c + fStack_72c;
            fStack_6e8 = fStack_748 + fStack_728;
            fStack_6e4 = fStack_744 + fStack_724;
            do {
              auVar168._8_4_ = 0x7f800000;
              auVar168._0_8_ = 0x7f8000007f800000;
              auVar168._12_4_ = 0x7f800000;
              auVar168._16_4_ = 0x7f800000;
              auVar168._20_4_ = 0x7f800000;
              auVar168._24_4_ = 0x7f800000;
              auVar168._28_4_ = 0x7f800000;
              auVar101 = vblendmps_avx512vl(auVar168,_local_760);
              auVar137._0_4_ =
                   (uint)(bVar77 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
              bVar84 = (bool)(bVar77 >> 1 & 1);
              auVar137._4_4_ = (uint)bVar84 * auVar101._4_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar77 >> 2 & 1);
              auVar137._8_4_ = (uint)bVar84 * auVar101._8_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar77 >> 3 & 1);
              auVar137._12_4_ = (uint)bVar84 * auVar101._12_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar77 >> 4 & 1);
              auVar137._16_4_ = (uint)bVar84 * auVar101._16_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar77 >> 5 & 1);
              auVar137._20_4_ = (uint)bVar84 * auVar101._20_4_ | (uint)!bVar84 * 0x7f800000;
              auVar137._24_4_ =
                   (uint)(bVar77 >> 6) * auVar101._24_4_ | (uint)!(bool)(bVar77 >> 6) * 0x7f800000;
              auVar137._28_4_ = 0x7f800000;
              auVar101 = vshufps_avx(auVar137,auVar137,0xb1);
              auVar101 = vminps_avx(auVar137,auVar101);
              auVar100 = vshufpd_avx(auVar101,auVar101,5);
              auVar101 = vminps_avx(auVar101,auVar100);
              auVar100 = vpermpd_avx2(auVar101,0x4e);
              auVar101 = vminps_avx(auVar101,auVar100);
              uVar17 = vcmpps_avx512vl(auVar137,auVar101,0);
              bVar72 = (byte)uVar17 & bVar77;
              bVar82 = bVar77;
              if (bVar72 != 0) {
                bVar82 = bVar72;
              }
              iVar18 = 0;
              for (uVar86 = (uint)bVar82; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
                iVar18 = iVar18 + 1;
              }
              bVar82 = '\x01' << ((byte)iVar18 & 0x1f);
              uVar86 = *(uint *)(local_6c0 + (uint)(iVar18 << 2));
              uVar146 = *(uint *)(local_1c0 + (uint)(iVar18 << 2));
              fVar251 = auVar14._0_4_;
              if ((float)local_8a0._0_4_ < 0.0) {
                fVar251 = sqrtf((float)local_8a0._0_4_);
              }
              auVar256 = ZEXT464(uVar86);
              auVar248 = ZEXT464(uVar146);
              bVar72 = ~bVar82;
              lVar83 = 5;
              do {
                fVar252 = auVar248._0_4_;
                auVar156._4_4_ = fVar252;
                auVar156._0_4_ = fVar252;
                auVar156._8_4_ = fVar252;
                auVar156._12_4_ = fVar252;
                auVar89 = vfmadd132ps_fma(auVar156,ZEXT816(0) << 0x40,local_890);
                fVar255 = auVar256._0_4_;
                fVar240 = 1.0 - fVar255;
                fVar244 = fVar240 * fVar240 * fVar240;
                fVar219 = fVar255 * fVar255 * fVar255;
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar244),
                                          ZEXT416((uint)fVar219));
                fVar253 = fVar255 * fVar240;
                auVar230 = ZEXT416((uint)fVar240);
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar255 * fVar253 * 6.0)),
                                          ZEXT416((uint)(fVar253 * fVar240)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar219),
                                         ZEXT416((uint)fVar244));
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar253 * fVar240 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar255 * fVar253)));
                fVar244 = fVar244 * 0.16666667;
                fVar245 = (auVar87._0_4_ + auVar90._0_4_) * 0.16666667;
                fVar254 = (auVar1._0_4_ + auVar88._0_4_) * 0.16666667;
                fVar219 = fVar219 * 0.16666667;
                auVar200._0_4_ = fVar219 * (float)local_880._0_4_;
                auVar200._4_4_ = fVar219 * (float)local_880._4_4_;
                auVar200._8_4_ = fVar219 * fStack_878;
                auVar200._12_4_ = fVar219 * fStack_874;
                auVar231._4_4_ = fVar254;
                auVar231._0_4_ = fVar254;
                auVar231._8_4_ = fVar254;
                auVar231._12_4_ = fVar254;
                auVar87 = vfmadd132ps_fma(auVar231,auVar200,local_840._0_16_);
                auVar201._4_4_ = fVar245;
                auVar201._0_4_ = fVar245;
                auVar201._8_4_ = fVar245;
                auVar201._12_4_ = fVar245;
                auVar87 = vfmadd132ps_fma(auVar201,auVar87,local_860._0_16_);
                auVar179._4_4_ = fVar244;
                auVar179._0_4_ = fVar244;
                auVar179._8_4_ = fVar244;
                auVar179._12_4_ = fVar244;
                local_770 = vfmadd132ps_fma(auVar179,auVar87,local_820._0_16_);
                auVar89 = vsubps_avx(auVar89,local_770);
                local_8c0._0_16_ = auVar89;
                auVar89 = vdpps_avx(auVar89,auVar89,0x7f);
                auVar87 = auVar256._0_16_;
                local_8e0._0_16_ = auVar89;
                if (auVar89._0_4_ < 0.0) {
                  auVar215._0_4_ = sqrtf(auVar89._0_4_);
                  auVar215._4_60_ = extraout_var;
                  auVar89 = auVar215._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar89,auVar89);
                }
                auVar90 = vfnmsub213ss_fma(auVar87,auVar87,ZEXT416((uint)(fVar253 * 4.0)));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar253 * 4.0)),auVar230,auVar230);
                fVar253 = fVar240 * -fVar240 * 0.5;
                fVar244 = auVar90._0_4_ * 0.5;
                fVar245 = auVar1._0_4_ * 0.5;
                fVar254 = fVar255 * fVar255 * 0.5;
                auVar220._0_4_ = fVar254 * (float)local_880._0_4_;
                auVar220._4_4_ = fVar254 * (float)local_880._4_4_;
                auVar220._8_4_ = fVar254 * fStack_878;
                auVar220._12_4_ = fVar254 * fStack_874;
                auVar180._4_4_ = fVar245;
                auVar180._0_4_ = fVar245;
                auVar180._8_4_ = fVar245;
                auVar180._12_4_ = fVar245;
                auVar1 = vfmadd132ps_fma(auVar180,auVar220,local_840._0_16_);
                auVar202._4_4_ = fVar244;
                auVar202._0_4_ = fVar244;
                auVar202._8_4_ = fVar244;
                auVar202._12_4_ = fVar244;
                auVar1 = vfmadd132ps_fma(auVar202,auVar1,local_860._0_16_);
                auVar260._4_4_ = fVar253;
                auVar260._0_4_ = fVar253;
                auVar260._8_4_ = fVar253;
                auVar260._12_4_ = fVar253;
                auVar1 = vfmadd132ps_fma(auVar260,auVar1,local_820._0_16_);
                local_790 = vdpps_avx(auVar1,auVar1,0x7f);
                auVar60._12_4_ = 0;
                auVar60._0_12_ = ZEXT812(0);
                fVar253 = local_790._0_4_;
                auVar90 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar253));
                fVar244 = auVar90._0_4_;
                local_7a0 = vrcp14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar253));
                auVar90 = vfnmadd213ss_fma(local_7a0,local_790,ZEXT416(0x40000000));
                uVar86 = auVar89._0_4_;
                local_780 = fVar240;
                fStack_77c = fVar240;
                fStack_778 = fVar240;
                fStack_774 = fVar240;
                if (fVar253 < -fVar253) {
                  fVar245 = sqrtf(fVar253);
                  auVar89 = ZEXT416(uVar86);
                }
                else {
                  auVar88 = vsqrtss_avx(local_790,local_790);
                  fVar245 = auVar88._0_4_;
                }
                fVar253 = fVar244 * 1.5 + fVar253 * -0.5 * fVar244 * fVar244 * fVar244;
                auVar157._0_4_ = auVar1._0_4_ * fVar253;
                auVar157._4_4_ = auVar1._4_4_ * fVar253;
                auVar157._8_4_ = auVar1._8_4_ * fVar253;
                auVar157._12_4_ = auVar1._12_4_ * fVar253;
                auVar88 = vdpps_avx(local_8c0._0_16_,auVar157,0x7f);
                fVar219 = auVar89._0_4_;
                fVar244 = auVar88._0_4_;
                auVar158._0_4_ = fVar244 * fVar244;
                auVar158._4_4_ = auVar88._4_4_ * auVar88._4_4_;
                auVar158._8_4_ = auVar88._8_4_ * auVar88._8_4_;
                auVar158._12_4_ = auVar88._12_4_ * auVar88._12_4_;
                auVar91 = vsubps_avx512vl(local_8e0._0_16_,auVar158);
                fVar254 = auVar91._0_4_;
                auVar181._4_12_ = ZEXT812(0) << 0x20;
                auVar181._0_4_ = fVar254;
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
                auVar93 = vmulss_avx512f(auVar92,ZEXT416(0x3fc00000));
                auVar94 = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
                if (fVar254 < 0.0) {
                  local_7c0 = fVar253;
                  fStack_7bc = fVar253;
                  fStack_7b8 = fVar253;
                  fStack_7b4 = fVar253;
                  local_7b0 = auVar92;
                  fVar254 = sqrtf(fVar254);
                  auVar94 = ZEXT416(auVar94._0_4_);
                  auVar93 = ZEXT416(auVar93._0_4_);
                  auVar89 = ZEXT416(uVar86);
                  auVar92 = local_7b0;
                  fVar253 = local_7c0;
                  fVar240 = fStack_7bc;
                  fVar241 = fStack_7b8;
                  fVar246 = fStack_7b4;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  fVar254 = auVar91._0_4_;
                  fVar240 = fVar253;
                  fVar241 = fVar253;
                  fVar246 = fVar253;
                }
                auVar262 = ZEXT1664(auVar1);
                auVar250 = ZEXT1664(local_8c0._0_16_);
                auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar267 = ZEXT3264(auVar101);
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar230,auVar87);
                auVar87 = vfmadd231ss_fma(auVar230,auVar87,SUB6416(ZEXT464(0xc0000000),0));
                auVar203._0_4_ = fVar255 * (float)local_880._0_4_;
                auVar203._4_4_ = fVar255 * (float)local_880._4_4_;
                auVar203._8_4_ = fVar255 * fStack_878;
                auVar203._12_4_ = fVar255 * fStack_874;
                auVar221._0_4_ = auVar87._0_4_;
                auVar221._4_4_ = auVar221._0_4_;
                auVar221._8_4_ = auVar221._0_4_;
                auVar221._12_4_ = auVar221._0_4_;
                auVar87 = vfmadd132ps_fma(auVar221,auVar203,local_840._0_16_);
                auVar182._0_4_ = auVar91._0_4_;
                auVar182._4_4_ = auVar182._0_4_;
                auVar182._8_4_ = auVar182._0_4_;
                auVar182._12_4_ = auVar182._0_4_;
                auVar87 = vfmadd132ps_fma(auVar182,auVar87,local_860._0_16_);
                auVar66._4_4_ = fStack_77c;
                auVar66._0_4_ = local_780;
                auVar66._8_4_ = fStack_778;
                auVar66._12_4_ = fStack_774;
                auVar87 = vfmadd132ps_fma(auVar66,auVar87,local_820._0_16_);
                auVar183._0_4_ = auVar87._0_4_ * (float)local_790._0_4_;
                auVar183._4_4_ = auVar87._4_4_ * (float)local_790._0_4_;
                auVar183._8_4_ = auVar87._8_4_ * (float)local_790._0_4_;
                auVar183._12_4_ = auVar87._12_4_ * (float)local_790._0_4_;
                auVar87 = vdpps_avx(auVar1,auVar87,0x7f);
                fVar259 = auVar87._0_4_;
                auVar204._0_4_ = auVar1._0_4_ * fVar259;
                auVar204._4_4_ = auVar1._4_4_ * fVar259;
                auVar204._8_4_ = auVar1._8_4_ * fVar259;
                auVar204._12_4_ = auVar1._12_4_ * fVar259;
                auVar87 = vsubps_avx(auVar183,auVar204);
                fVar259 = auVar90._0_4_ * (float)local_7a0._0_4_;
                auVar230 = vmaxss_avx(ZEXT416((uint)fVar249),
                                      ZEXT416((uint)(fVar252 * fVar251 * 1.9073486e-06)));
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar139._16_16_ = auVar101._16_16_;
                auVar95 = vxorps_avx512vl(auVar1,auVar19);
                auVar205._0_4_ = fVar253 * auVar87._0_4_ * fVar259;
                auVar205._4_4_ = fVar240 * auVar87._4_4_ * fVar259;
                auVar205._8_4_ = fVar241 * auVar87._8_4_ * fVar259;
                auVar205._12_4_ = fVar246 * auVar87._12_4_ * fVar259;
                auVar258 = ZEXT1664(auVar157);
                auVar87 = vdpps_avx(auVar95,auVar157,0x7f);
                auVar90 = vfmadd213ss_fma(auVar89,ZEXT416((uint)fVar249),auVar230);
                auVar89 = vdpps_avx(local_8c0._0_16_,auVar205,0x7f);
                auVar91 = vfmadd213ss_fma(ZEXT416((uint)(fVar219 + 1.0)),
                                          ZEXT416((uint)(fVar249 / fVar245)),auVar90);
                auVar265 = ZEXT1664(auVar91);
                fVar253 = auVar87._0_4_ + auVar89._0_4_;
                auVar89 = vdpps_avx(local_890,auVar157,0x7f);
                auVar87 = vdpps_avx(local_8c0._0_16_,auVar95,0x7f);
                auVar90 = vmulss_avx512f(auVar94,auVar92);
                auVar94 = vaddss_avx512f(auVar93,ZEXT416((uint)(auVar90._0_4_ *
                                                               auVar92._0_4_ * auVar92._0_4_)));
                auVar90 = vdpps_avx(local_8c0._0_16_,local_890,0x7f);
                auVar92 = vfnmadd231ss_fma(auVar87,auVar88,ZEXT416((uint)fVar253));
                auVar93 = vfnmadd231ss_fma(auVar90,auVar88,auVar89);
                auVar87 = vpermilps_avx(local_770,0xff);
                fVar254 = fVar254 - auVar87._0_4_;
                auVar87 = vshufps_avx(auVar1,auVar1,0xff);
                auVar90 = vfmsub213ss_fma(auVar92,auVar94,auVar87);
                fVar245 = auVar93._0_4_ * auVar94._0_4_;
                auVar92 = vfmsub231ss_fma(ZEXT416((uint)(auVar89._0_4_ * auVar90._0_4_)),
                                          ZEXT416((uint)fVar253),ZEXT416((uint)fVar245));
                fVar219 = auVar92._0_4_;
                fVar245 = fVar244 * (fVar245 / fVar219) - fVar254 * (auVar89._0_4_ / fVar219);
                auVar242 = ZEXT464((uint)fVar245);
                fVar255 = fVar255 - fVar245;
                auVar256 = ZEXT464((uint)fVar255);
                fVar252 = fVar252 - (fVar254 * (fVar253 / fVar219) -
                                    fVar244 * (auVar90._0_4_ / fVar219));
                auVar248 = ZEXT464((uint)fVar252);
                auVar232._8_4_ = 0x7fffffff;
                auVar232._0_8_ = 0x7fffffff7fffffff;
                auVar232._12_4_ = 0x7fffffff;
                auVar89 = vandps_avx(auVar88,auVar232);
                bVar84 = true;
                if (auVar89._0_4_ < auVar91._0_4_) {
                  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(auVar91._0_4_ + auVar230._0_4_)),
                                            local_7e0,ZEXT416(0x36000000));
                  auVar89 = vandps_avx(ZEXT416((uint)fVar254),auVar232);
                  if (auVar89._0_4_ < auVar90._0_4_) {
                    fVar252 = fVar252 + (float)local_7d0._0_4_;
                    auVar248 = ZEXT464((uint)fVar252);
                    if (fVar153 <= fVar252) {
                      fVar253 = *(float *)(ray + k * 4 + 0x100);
                      auVar242 = ZEXT464((uint)fVar253);
                      if (((fVar252 <= fVar253) && (0.0 <= fVar255)) && (fVar255 <= 1.0)) {
                        auVar139._0_16_ = ZEXT816(0) << 0x20;
                        auVar138._4_28_ = auVar139._4_28_;
                        auVar138._0_4_ = local_8e0._0_4_;
                        auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar138._0_16_);
                        fVar244 = auVar89._0_4_;
                        auVar89 = vmulss_avx512f(local_8e0._0_16_,ZEXT416(0xbf000000));
                        pGVar4 = (context->scene->geometries).items[uVar79].ptr;
                        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            bVar82 = true;
                          }
                          else {
                            fVar244 = fVar244 * 1.5 + auVar89._0_4_ * fVar244 * fVar244 * fVar244;
                            auVar184._0_4_ = local_8c0._0_4_ * fVar244;
                            auVar184._4_4_ = local_8c0._4_4_ * fVar244;
                            auVar184._8_4_ = local_8c0._8_4_ * fVar244;
                            auVar184._12_4_ = local_8c0._12_4_ * fVar244;
                            auVar88 = vfmadd213ps_fma(auVar87,auVar184,auVar1);
                            auVar89 = vshufps_avx(auVar184,auVar184,0xc9);
                            auVar87 = vshufps_avx(auVar1,auVar1,0xc9);
                            auVar185._0_4_ = auVar184._0_4_ * auVar87._0_4_;
                            auVar185._4_4_ = auVar184._4_4_ * auVar87._4_4_;
                            auVar185._8_4_ = auVar184._8_4_ * auVar87._8_4_;
                            auVar185._12_4_ = auVar184._12_4_ * auVar87._12_4_;
                            auVar90 = vfmsub231ps_fma(auVar185,auVar1,auVar89);
                            auVar89 = vshufps_avx(auVar90,auVar90,0xc9);
                            auVar87 = vshufps_avx(auVar88,auVar88,0xc9);
                            auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                            auVar159._0_4_ = auVar88._0_4_ * auVar90._0_4_;
                            auVar159._4_4_ = auVar88._4_4_ * auVar90._4_4_;
                            auVar159._8_4_ = auVar88._8_4_ * auVar90._8_4_;
                            auVar159._12_4_ = auVar88._12_4_ * auVar90._12_4_;
                            auVar89 = vfmsub231ps_fma(auVar159,auVar89,auVar87);
                            auVar212._8_4_ = 1;
                            auVar212._0_8_ = 0x100000001;
                            auVar212._12_4_ = 1;
                            auVar212._16_4_ = 1;
                            auVar212._20_4_ = 1;
                            auVar212._24_4_ = 1;
                            auVar212._28_4_ = 1;
                            auVar101 = vpermps_avx2(auVar212,ZEXT1632(auVar89));
                            auVar226._8_4_ = 2;
                            auVar226._0_8_ = 0x200000002;
                            auVar226._12_4_ = 2;
                            auVar226._16_4_ = 2;
                            auVar226._20_4_ = 2;
                            auVar226._24_4_ = 2;
                            auVar226._28_4_ = 2;
                            local_580 = vpermps_avx2(auVar226,ZEXT1632(auVar89));
                            local_560 = auVar89._0_4_;
                            local_5a0[0] = (RTCHitN)auVar101[0];
                            local_5a0[1] = (RTCHitN)auVar101[1];
                            local_5a0[2] = (RTCHitN)auVar101[2];
                            local_5a0[3] = (RTCHitN)auVar101[3];
                            local_5a0[4] = (RTCHitN)auVar101[4];
                            local_5a0[5] = (RTCHitN)auVar101[5];
                            local_5a0[6] = (RTCHitN)auVar101[6];
                            local_5a0[7] = (RTCHitN)auVar101[7];
                            local_5a0[8] = (RTCHitN)auVar101[8];
                            local_5a0[9] = (RTCHitN)auVar101[9];
                            local_5a0[10] = (RTCHitN)auVar101[10];
                            local_5a0[0xb] = (RTCHitN)auVar101[0xb];
                            local_5a0[0xc] = (RTCHitN)auVar101[0xc];
                            local_5a0[0xd] = (RTCHitN)auVar101[0xd];
                            local_5a0[0xe] = (RTCHitN)auVar101[0xe];
                            local_5a0[0xf] = (RTCHitN)auVar101[0xf];
                            local_5a0[0x10] = (RTCHitN)auVar101[0x10];
                            local_5a0[0x11] = (RTCHitN)auVar101[0x11];
                            local_5a0[0x12] = (RTCHitN)auVar101[0x12];
                            local_5a0[0x13] = (RTCHitN)auVar101[0x13];
                            local_5a0[0x14] = (RTCHitN)auVar101[0x14];
                            local_5a0[0x15] = (RTCHitN)auVar101[0x15];
                            local_5a0[0x16] = (RTCHitN)auVar101[0x16];
                            local_5a0[0x17] = (RTCHitN)auVar101[0x17];
                            local_5a0[0x18] = (RTCHitN)auVar101[0x18];
                            local_5a0[0x19] = (RTCHitN)auVar101[0x19];
                            local_5a0[0x1a] = (RTCHitN)auVar101[0x1a];
                            local_5a0[0x1b] = (RTCHitN)auVar101[0x1b];
                            local_5a0[0x1c] = (RTCHitN)auVar101[0x1c];
                            local_5a0[0x1d] = (RTCHitN)auVar101[0x1d];
                            local_5a0[0x1e] = (RTCHitN)auVar101[0x1e];
                            local_5a0[0x1f] = (RTCHitN)auVar101[0x1f];
                            uStack_55c = local_560;
                            uStack_558 = local_560;
                            uStack_554 = local_560;
                            uStack_550 = local_560;
                            uStack_54c = local_560;
                            uStack_548 = local_560;
                            uStack_544 = local_560;
                            local_540 = fVar255;
                            fStack_53c = fVar255;
                            fStack_538 = fVar255;
                            fStack_534 = fVar255;
                            fStack_530 = fVar255;
                            fStack_52c = fVar255;
                            fStack_528 = fVar255;
                            fStack_524 = fVar255;
                            local_520 = ZEXT432(0) << 0x20;
                            local_500 = local_660._0_8_;
                            uStack_4f8 = local_660._8_8_;
                            uStack_4f0 = local_660._16_8_;
                            uStack_4e8 = local_660._24_8_;
                            local_4e0 = local_680;
                            vpcmpeqd_avx2(local_680,local_680);
                            local_4c0 = context->user->instID[0];
                            uStack_4bc = local_4c0;
                            uStack_4b8 = local_4c0;
                            uStack_4b4 = local_4c0;
                            uStack_4b0 = local_4c0;
                            uStack_4ac = local_4c0;
                            uStack_4a8 = local_4c0;
                            uStack_4a4 = local_4c0;
                            local_4a0 = context->user->instPrimID[0];
                            uStack_49c = local_4a0;
                            uStack_498 = local_4a0;
                            uStack_494 = local_4a0;
                            uStack_490 = local_4a0;
                            uStack_48c = local_4a0;
                            uStack_488 = local_4a0;
                            uStack_484 = local_4a0;
                            *(float *)(ray + k * 4 + 0x100) = fVar252;
                            local_800 = local_6a0._0_8_;
                            uStack_7f8 = local_6a0._8_8_;
                            uStack_7f0 = local_6a0._16_8_;
                            uStack_7e8 = local_6a0._24_8_;
                            local_910.valid = (int *)&local_800;
                            local_910.geometryUserPtr = pGVar4->userPtr;
                            local_910.context = context->user;
                            local_910.hit = local_5a0;
                            local_910.N = 8;
                            local_910.ray = (RTCRayN *)ray;
                            if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar250 = ZEXT1664(local_8c0._0_16_);
                              auVar258 = ZEXT1664(auVar157);
                              auVar262 = ZEXT1664(auVar1);
                              auVar265 = ZEXT1664(auVar91);
                              (*pGVar4->occlusionFilterN)(&local_910);
                              auVar248 = ZEXT1664(ZEXT416((uint)fVar252));
                              auVar256 = ZEXT1664(ZEXT416((uint)fVar255));
                              auVar232._8_4_ = 0x7fffffff;
                              auVar232._0_8_ = 0x7fffffff7fffffff;
                              auVar232._12_4_ = 0x7fffffff;
                              auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar267 = ZEXT3264(auVar101);
                            }
                            auVar62._8_8_ = uStack_7f8;
                            auVar62._0_8_ = local_800;
                            auVar62._16_8_ = uStack_7f0;
                            auVar62._24_8_ = uStack_7e8;
                            if (auVar62 == (undefined1  [32])0x0) {
                              bVar82 = false;
                            }
                            else {
                              p_Var5 = context->args->filter;
                              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar250 = ZEXT1664(auVar250._0_16_);
                                auVar258 = ZEXT1664(auVar258._0_16_);
                                auVar262 = ZEXT1664(auVar262._0_16_);
                                auVar265 = ZEXT1664(auVar265._0_16_);
                                (*p_Var5)(&local_910);
                                auVar248 = ZEXT1664(ZEXT416((uint)fVar252));
                                auVar256 = ZEXT1664(ZEXT416((uint)fVar255));
                                auVar232._8_4_ = 0x7fffffff;
                                auVar232._0_8_ = 0x7fffffff7fffffff;
                                auVar232._12_4_ = 0x7fffffff;
                                auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar267 = ZEXT3264(auVar101);
                              }
                              auVar63._8_8_ = uStack_7f8;
                              auVar63._0_8_ = local_800;
                              auVar63._16_8_ = uStack_7f0;
                              auVar63._24_8_ = uStack_7e8;
                              uVar76 = vptestmd_avx512vl(auVar63,auVar63);
                              auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              bVar84 = (bool)((byte)uVar76 & 1);
                              bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
                              bVar7 = (bool)((byte)(uVar76 >> 2) & 1);
                              bVar8 = (bool)((byte)(uVar76 >> 3) & 1);
                              bVar9 = (bool)((byte)(uVar76 >> 4) & 1);
                              bVar10 = (bool)((byte)(uVar76 >> 5) & 1);
                              bVar11 = (bool)((byte)(uVar76 >> 6) & 1);
                              bVar12 = SUB81(uVar76 >> 7,0);
                              *(uint *)(local_910.ray + 0x100) =
                                   (uint)bVar84 * auVar101._0_4_ |
                                   (uint)!bVar84 * *(int *)(local_910.ray + 0x100);
                              *(uint *)(local_910.ray + 0x104) =
                                   (uint)bVar6 * auVar101._4_4_ |
                                   (uint)!bVar6 * *(int *)(local_910.ray + 0x104);
                              *(uint *)(local_910.ray + 0x108) =
                                   (uint)bVar7 * auVar101._8_4_ |
                                   (uint)!bVar7 * *(int *)(local_910.ray + 0x108);
                              *(uint *)(local_910.ray + 0x10c) =
                                   (uint)bVar8 * auVar101._12_4_ |
                                   (uint)!bVar8 * *(int *)(local_910.ray + 0x10c);
                              *(uint *)(local_910.ray + 0x110) =
                                   (uint)bVar9 * auVar101._16_4_ |
                                   (uint)!bVar9 * *(int *)(local_910.ray + 0x110);
                              *(uint *)(local_910.ray + 0x114) =
                                   (uint)bVar10 * auVar101._20_4_ |
                                   (uint)!bVar10 * *(int *)(local_910.ray + 0x114);
                              *(uint *)(local_910.ray + 0x118) =
                                   (uint)bVar11 * auVar101._24_4_ |
                                   (uint)!bVar11 * *(int *)(local_910.ray + 0x118);
                              *(uint *)(local_910.ray + 0x11c) =
                                   (uint)bVar12 * auVar101._28_4_ |
                                   (uint)!bVar12 * *(int *)(local_910.ray + 0x11c);
                              bVar82 = auVar63 != (undefined1  [32])0x0;
                            }
                            if ((bool)bVar82 == false) {
                              *(float *)(ray + k * 4 + 0x100) = fVar253;
                            }
                          }
                          auVar242 = ZEXT464((uint)fVar253);
                          bVar84 = false;
                          goto LAB_01e119d9;
                        }
                      }
                    }
                    bVar84 = false;
                    bVar82 = 0;
                  }
                }
LAB_01e119d9:
                if (!bVar84) goto LAB_01e11d14;
                lVar83 = lVar83 + -1;
              } while (lVar83 != 0);
              bVar82 = 0;
LAB_01e11d14:
              bVar81 = bVar81 | bVar82 & 1;
              auVar68._4_4_ = fStack_6fc;
              auVar68._0_4_ = local_700;
              auVar68._8_4_ = fStack_6f8;
              auVar68._12_4_ = fStack_6f4;
              auVar68._16_4_ = fStack_6f0;
              auVar68._20_4_ = fStack_6ec;
              auVar68._24_4_ = fStack_6e8;
              auVar68._28_4_ = fStack_6e4;
              uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar26._4_4_ = uVar154;
              auVar26._0_4_ = uVar154;
              auVar26._8_4_ = uVar154;
              auVar26._12_4_ = uVar154;
              auVar26._16_4_ = uVar154;
              auVar26._20_4_ = uVar154;
              auVar26._24_4_ = uVar154;
              auVar26._28_4_ = uVar154;
              uVar17 = vcmpps_avx512vl(auVar68,auVar26,2);
              bVar77 = bVar72 & bVar77 & (byte)uVar17;
            } while (bVar77 != 0);
          }
          auVar169._0_4_ = (float)local_740._0_4_ + (float)local_720._0_4_;
          auVar169._4_4_ = (float)local_740._4_4_ + (float)local_720._4_4_;
          auVar169._8_4_ = fStack_738 + fStack_718;
          auVar169._12_4_ = fStack_734 + fStack_714;
          auVar169._16_4_ = fStack_730 + fStack_710;
          auVar169._20_4_ = fStack_72c + fStack_70c;
          auVar169._24_4_ = fStack_728 + fStack_708;
          auVar169._28_4_ = fStack_724 + fStack_704;
          uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar27._4_4_ = uVar154;
          auVar27._0_4_ = uVar154;
          auVar27._8_4_ = uVar154;
          auVar27._12_4_ = uVar154;
          auVar27._16_4_ = uVar154;
          auVar27._20_4_ = uVar154;
          auVar27._24_4_ = uVar154;
          auVar27._28_4_ = uVar154;
          uVar17 = vcmpps_avx512vl(auVar169,auVar27,2);
          bVar78 = (byte)uVar15 | ~bVar78;
          bVar71 = (byte)uVar16 & bVar71 & (byte)uVar17;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar28._8_4_ = 3;
          auVar28._0_8_ = 0x300000003;
          auVar28._12_4_ = 3;
          auVar28._16_4_ = 3;
          auVar28._20_4_ = 3;
          auVar28._24_4_ = 3;
          auVar28._28_4_ = 3;
          auVar101 = vpblendmd_avx512vl(auVar170,auVar28);
          local_720._0_4_ = (uint)(bVar78 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar78 & 1) * 2;
          bVar84 = (bool)(bVar78 >> 1 & 1);
          local_720._4_4_ = (uint)bVar84 * auVar101._4_4_ | (uint)!bVar84 * 2;
          bVar84 = (bool)(bVar78 >> 2 & 1);
          fStack_718 = (float)((uint)bVar84 * auVar101._8_4_ | (uint)!bVar84 * 2);
          bVar84 = (bool)(bVar78 >> 3 & 1);
          fStack_714 = (float)((uint)bVar84 * auVar101._12_4_ | (uint)!bVar84 * 2);
          bVar84 = (bool)(bVar78 >> 4 & 1);
          fStack_710 = (float)((uint)bVar84 * auVar101._16_4_ | (uint)!bVar84 * 2);
          bVar84 = (bool)(bVar78 >> 5 & 1);
          fStack_70c = (float)((uint)bVar84 * auVar101._20_4_ | (uint)!bVar84 * 2);
          bVar84 = (bool)(bVar78 >> 6 & 1);
          fStack_708 = (float)((uint)bVar84 * auVar101._24_4_ | (uint)!bVar84 * 2);
          fStack_704 = (float)((uint)(bVar78 >> 7) * auVar101._28_4_ |
                              (uint)!(bool)(bVar78 >> 7) * 2);
          uVar15 = vpcmpd_avx512vl(_local_720,local_640,2);
          bVar78 = (byte)uVar15 & bVar71;
          if (bVar78 != 0) {
            auVar87 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar89 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar1 = vminps_avx(local_840._0_16_,local_880._0_16_);
            auVar90 = vminps_avx(auVar87,auVar1);
            auVar87 = vmaxps_avx(local_840._0_16_,local_880._0_16_);
            auVar1 = vmaxps_avx(auVar89,auVar87);
            auVar89 = vandps_avx(auVar90,auVar232);
            auVar87 = vandps_avx(auVar1,auVar232);
            auVar89 = vmaxps_avx(auVar89,auVar87);
            auVar87 = vmovshdup_avx(auVar89);
            auVar87 = vmaxss_avx(auVar87,auVar89);
            auVar89 = vshufpd_avx(auVar89,auVar89,1);
            auVar89 = vmaxss_avx(auVar89,auVar87);
            fVar249 = auVar89._0_4_ * 1.9073486e-06;
            local_7e0 = vshufps_avx(auVar1,auVar1,0xff);
            _local_760 = _local_480;
            local_700 = (float)local_740._0_4_ + (float)local_480._0_4_;
            fStack_6fc = (float)local_740._4_4_ + (float)local_480._4_4_;
            fStack_6f8 = fStack_738 + fStack_478;
            fStack_6f4 = fStack_734 + fStack_474;
            fStack_6f0 = fStack_730 + fStack_470;
            fStack_6ec = fStack_72c + fStack_46c;
            fStack_6e8 = fStack_728 + fStack_468;
            fStack_6e4 = fStack_724 + fStack_464;
            do {
              auVar171._8_4_ = 0x7f800000;
              auVar171._0_8_ = 0x7f8000007f800000;
              auVar171._12_4_ = 0x7f800000;
              auVar171._16_4_ = 0x7f800000;
              auVar171._20_4_ = 0x7f800000;
              auVar171._24_4_ = 0x7f800000;
              auVar171._28_4_ = 0x7f800000;
              auVar101 = vblendmps_avx512vl(auVar171,_local_760);
              auVar140._0_4_ =
                   (uint)(bVar78 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
              bVar84 = (bool)(bVar78 >> 1 & 1);
              auVar140._4_4_ = (uint)bVar84 * auVar101._4_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar78 >> 2 & 1);
              auVar140._8_4_ = (uint)bVar84 * auVar101._8_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar78 >> 3 & 1);
              auVar140._12_4_ = (uint)bVar84 * auVar101._12_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar78 >> 4 & 1);
              auVar140._16_4_ = (uint)bVar84 * auVar101._16_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar78 >> 5 & 1);
              auVar140._20_4_ = (uint)bVar84 * auVar101._20_4_ | (uint)!bVar84 * 0x7f800000;
              auVar140._24_4_ =
                   (uint)(bVar78 >> 6) * auVar101._24_4_ | (uint)!(bool)(bVar78 >> 6) * 0x7f800000;
              auVar140._28_4_ = 0x7f800000;
              auVar101 = vshufps_avx(auVar140,auVar140,0xb1);
              auVar101 = vminps_avx(auVar140,auVar101);
              auVar100 = vshufpd_avx(auVar101,auVar101,5);
              auVar101 = vminps_avx(auVar101,auVar100);
              auVar100 = vpermpd_avx2(auVar101,0x4e);
              auVar101 = vminps_avx(auVar101,auVar100);
              uVar15 = vcmpps_avx512vl(auVar140,auVar101,0);
              bVar82 = (byte)uVar15 & bVar78;
              bVar77 = bVar78;
              if (bVar82 != 0) {
                bVar77 = bVar82;
              }
              iVar18 = 0;
              for (uVar86 = (uint)bVar77; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
                iVar18 = iVar18 + 1;
              }
              bVar77 = '\x01' << ((byte)iVar18 & 0x1f);
              uVar86 = *(uint *)(local_6e0 + (uint)(iVar18 << 2));
              uVar146 = *(uint *)(local_460 + (uint)(iVar18 << 2));
              fVar251 = auVar13._0_4_;
              if ((float)local_8a0._0_4_ < 0.0) {
                fVar251 = sqrtf((float)local_8a0._0_4_);
              }
              auVar256 = ZEXT464(uVar86);
              auVar248 = ZEXT464(uVar146);
              bVar82 = ~bVar77;
              lVar83 = 5;
              do {
                fVar252 = auVar248._0_4_;
                auVar160._4_4_ = fVar252;
                auVar160._0_4_ = fVar252;
                auVar160._8_4_ = fVar252;
                auVar160._12_4_ = fVar252;
                auVar89 = vfmadd132ps_fma(auVar160,ZEXT816(0) << 0x40,local_890);
                fVar255 = auVar256._0_4_;
                fVar240 = 1.0 - fVar255;
                fVar244 = fVar240 * fVar240 * fVar240;
                fVar219 = fVar255 * fVar255 * fVar255;
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar244),
                                          ZEXT416((uint)fVar219));
                fVar253 = fVar255 * fVar240;
                auVar230 = ZEXT416((uint)fVar240);
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar255 * fVar253 * 6.0)),
                                          ZEXT416((uint)(fVar253 * fVar240)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar219),
                                         ZEXT416((uint)fVar244));
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar253 * fVar240 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar255 * fVar253)));
                fVar244 = fVar244 * 0.16666667;
                fVar245 = (auVar87._0_4_ + auVar90._0_4_) * 0.16666667;
                fVar254 = (auVar1._0_4_ + auVar88._0_4_) * 0.16666667;
                fVar219 = fVar219 * 0.16666667;
                auVar206._0_4_ = fVar219 * (float)local_880._0_4_;
                auVar206._4_4_ = fVar219 * (float)local_880._4_4_;
                auVar206._8_4_ = fVar219 * fStack_878;
                auVar206._12_4_ = fVar219 * fStack_874;
                auVar233._4_4_ = fVar254;
                auVar233._0_4_ = fVar254;
                auVar233._8_4_ = fVar254;
                auVar233._12_4_ = fVar254;
                auVar87 = vfmadd132ps_fma(auVar233,auVar206,local_840._0_16_);
                auVar207._4_4_ = fVar245;
                auVar207._0_4_ = fVar245;
                auVar207._8_4_ = fVar245;
                auVar207._12_4_ = fVar245;
                auVar87 = vfmadd132ps_fma(auVar207,auVar87,local_860._0_16_);
                auVar186._4_4_ = fVar244;
                auVar186._0_4_ = fVar244;
                auVar186._8_4_ = fVar244;
                auVar186._12_4_ = fVar244;
                local_770 = vfmadd132ps_fma(auVar186,auVar87,local_820._0_16_);
                auVar89 = vsubps_avx(auVar89,local_770);
                local_8c0._0_16_ = auVar89;
                auVar89 = vdpps_avx(auVar89,auVar89,0x7f);
                auVar87 = auVar256._0_16_;
                local_8e0._0_16_ = auVar89;
                if (auVar89._0_4_ < 0.0) {
                  auVar242._0_4_ = sqrtf(auVar89._0_4_);
                  auVar242._4_60_ = extraout_var_00;
                  auVar89 = auVar242._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar89,auVar89);
                }
                auVar90 = vfnmsub213ss_fma(auVar87,auVar87,ZEXT416((uint)(fVar253 * 4.0)));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar253 * 4.0)),auVar230,auVar230);
                fVar253 = fVar240 * -fVar240 * 0.5;
                fVar244 = auVar90._0_4_ * 0.5;
                fVar245 = auVar1._0_4_ * 0.5;
                fVar254 = fVar255 * fVar255 * 0.5;
                auVar222._0_4_ = fVar254 * (float)local_880._0_4_;
                auVar222._4_4_ = fVar254 * (float)local_880._4_4_;
                auVar222._8_4_ = fVar254 * fStack_878;
                auVar222._12_4_ = fVar254 * fStack_874;
                auVar187._4_4_ = fVar245;
                auVar187._0_4_ = fVar245;
                auVar187._8_4_ = fVar245;
                auVar187._12_4_ = fVar245;
                auVar1 = vfmadd132ps_fma(auVar187,auVar222,local_840._0_16_);
                auVar208._4_4_ = fVar244;
                auVar208._0_4_ = fVar244;
                auVar208._8_4_ = fVar244;
                auVar208._12_4_ = fVar244;
                auVar1 = vfmadd132ps_fma(auVar208,auVar1,local_860._0_16_);
                auVar261._4_4_ = fVar253;
                auVar261._0_4_ = fVar253;
                auVar261._8_4_ = fVar253;
                auVar261._12_4_ = fVar253;
                auVar1 = vfmadd132ps_fma(auVar261,auVar1,local_820._0_16_);
                local_790 = vdpps_avx(auVar1,auVar1,0x7f);
                auVar61._12_4_ = 0;
                auVar61._0_12_ = ZEXT812(0);
                fVar253 = local_790._0_4_;
                auVar90 = vrsqrt14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar253));
                fVar244 = auVar90._0_4_;
                local_7a0 = vrcp14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar253));
                auVar90 = vfnmadd213ss_fma(local_7a0,local_790,ZEXT416(0x40000000));
                uVar86 = auVar89._0_4_;
                local_780 = fVar240;
                fStack_77c = fVar240;
                fStack_778 = fVar240;
                fStack_774 = fVar240;
                if (fVar253 < -fVar253) {
                  fVar245 = sqrtf(fVar253);
                  auVar89 = ZEXT416(uVar86);
                }
                else {
                  auVar88 = vsqrtss_avx(local_790,local_790);
                  fVar245 = auVar88._0_4_;
                }
                fVar253 = fVar244 * 1.5 + fVar253 * -0.5 * fVar244 * fVar244 * fVar244;
                auVar161._0_4_ = auVar1._0_4_ * fVar253;
                auVar161._4_4_ = auVar1._4_4_ * fVar253;
                auVar161._8_4_ = auVar1._8_4_ * fVar253;
                auVar161._12_4_ = auVar1._12_4_ * fVar253;
                auVar88 = vdpps_avx(local_8c0._0_16_,auVar161,0x7f);
                fVar219 = auVar89._0_4_;
                fVar244 = auVar88._0_4_;
                auVar162._0_4_ = fVar244 * fVar244;
                auVar162._4_4_ = auVar88._4_4_ * auVar88._4_4_;
                auVar162._8_4_ = auVar88._8_4_ * auVar88._8_4_;
                auVar162._12_4_ = auVar88._12_4_ * auVar88._12_4_;
                auVar91 = vsubps_avx512vl(local_8e0._0_16_,auVar162);
                fVar254 = auVar91._0_4_;
                auVar188._4_12_ = ZEXT812(0) << 0x20;
                auVar188._0_4_ = fVar254;
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
                auVar93 = vmulss_avx512f(auVar92,ZEXT416(0x3fc00000));
                auVar94 = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
                if (fVar254 < 0.0) {
                  local_7c0 = fVar253;
                  fStack_7bc = fVar253;
                  fStack_7b8 = fVar253;
                  fStack_7b4 = fVar253;
                  local_7b0 = auVar92;
                  fVar254 = sqrtf(fVar254);
                  auVar94 = ZEXT416(auVar94._0_4_);
                  auVar93 = ZEXT416(auVar93._0_4_);
                  auVar89 = ZEXT416(uVar86);
                  auVar92 = local_7b0;
                  fVar253 = local_7c0;
                  fVar240 = fStack_7bc;
                  fVar241 = fStack_7b8;
                  fVar246 = fStack_7b4;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  fVar254 = auVar91._0_4_;
                  fVar240 = fVar253;
                  fVar241 = fVar253;
                  fVar246 = fVar253;
                }
                auVar262 = ZEXT1664(auVar1);
                auVar250 = ZEXT1664(local_8c0._0_16_);
                auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar267 = ZEXT3264(auVar101);
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar230,auVar87);
                auVar87 = vfmadd231ss_fma(auVar230,auVar87,SUB6416(ZEXT464(0xc0000000),0));
                auVar209._0_4_ = fVar255 * (float)local_880._0_4_;
                auVar209._4_4_ = fVar255 * (float)local_880._4_4_;
                auVar209._8_4_ = fVar255 * fStack_878;
                auVar209._12_4_ = fVar255 * fStack_874;
                auVar223._0_4_ = auVar87._0_4_;
                auVar223._4_4_ = auVar223._0_4_;
                auVar223._8_4_ = auVar223._0_4_;
                auVar223._12_4_ = auVar223._0_4_;
                auVar87 = vfmadd132ps_fma(auVar223,auVar209,local_840._0_16_);
                auVar189._0_4_ = auVar91._0_4_;
                auVar189._4_4_ = auVar189._0_4_;
                auVar189._8_4_ = auVar189._0_4_;
                auVar189._12_4_ = auVar189._0_4_;
                auVar87 = vfmadd132ps_fma(auVar189,auVar87,local_860._0_16_);
                auVar67._4_4_ = fStack_77c;
                auVar67._0_4_ = local_780;
                auVar67._8_4_ = fStack_778;
                auVar67._12_4_ = fStack_774;
                auVar87 = vfmadd132ps_fma(auVar67,auVar87,local_820._0_16_);
                auVar190._0_4_ = auVar87._0_4_ * (float)local_790._0_4_;
                auVar190._4_4_ = auVar87._4_4_ * (float)local_790._0_4_;
                auVar190._8_4_ = auVar87._8_4_ * (float)local_790._0_4_;
                auVar190._12_4_ = auVar87._12_4_ * (float)local_790._0_4_;
                auVar87 = vdpps_avx(auVar1,auVar87,0x7f);
                fVar259 = auVar87._0_4_;
                auVar210._0_4_ = auVar1._0_4_ * fVar259;
                auVar210._4_4_ = auVar1._4_4_ * fVar259;
                auVar210._8_4_ = auVar1._8_4_ * fVar259;
                auVar210._12_4_ = auVar1._12_4_ * fVar259;
                auVar87 = vsubps_avx(auVar190,auVar210);
                fVar259 = auVar90._0_4_ * (float)local_7a0._0_4_;
                auVar230 = vmaxss_avx(ZEXT416((uint)fVar249),
                                      ZEXT416((uint)(fVar252 * fVar251 * 1.9073486e-06)));
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar142._16_16_ = auVar101._16_16_;
                auVar95 = vxorps_avx512vl(auVar1,auVar20);
                auVar211._0_4_ = fVar253 * auVar87._0_4_ * fVar259;
                auVar211._4_4_ = fVar240 * auVar87._4_4_ * fVar259;
                auVar211._8_4_ = fVar241 * auVar87._8_4_ * fVar259;
                auVar211._12_4_ = fVar246 * auVar87._12_4_ * fVar259;
                auVar258 = ZEXT1664(auVar161);
                auVar87 = vdpps_avx(auVar95,auVar161,0x7f);
                auVar90 = vfmadd213ss_fma(auVar89,ZEXT416((uint)fVar249),auVar230);
                auVar89 = vdpps_avx(local_8c0._0_16_,auVar211,0x7f);
                auVar91 = vfmadd213ss_fma(ZEXT416((uint)(fVar219 + 1.0)),
                                          ZEXT416((uint)(fVar249 / fVar245)),auVar90);
                auVar265 = ZEXT1664(auVar91);
                fVar253 = auVar87._0_4_ + auVar89._0_4_;
                auVar89 = vdpps_avx(local_890,auVar161,0x7f);
                auVar87 = vdpps_avx(local_8c0._0_16_,auVar95,0x7f);
                auVar90 = vmulss_avx512f(auVar94,auVar92);
                auVar94 = vaddss_avx512f(auVar93,ZEXT416((uint)(auVar90._0_4_ *
                                                               auVar92._0_4_ * auVar92._0_4_)));
                auVar90 = vdpps_avx(local_8c0._0_16_,local_890,0x7f);
                auVar92 = vfnmadd231ss_fma(auVar87,auVar88,ZEXT416((uint)fVar253));
                auVar93 = vfnmadd231ss_fma(auVar90,auVar88,auVar89);
                auVar87 = vpermilps_avx(local_770,0xff);
                fVar254 = fVar254 - auVar87._0_4_;
                auVar87 = vshufps_avx(auVar1,auVar1,0xff);
                auVar90 = vfmsub213ss_fma(auVar92,auVar94,auVar87);
                fVar245 = auVar93._0_4_ * auVar94._0_4_;
                auVar92 = vfmsub231ss_fma(ZEXT416((uint)(auVar89._0_4_ * auVar90._0_4_)),
                                          ZEXT416((uint)fVar253),ZEXT416((uint)fVar245));
                fVar219 = auVar92._0_4_;
                fVar245 = fVar244 * (fVar245 / fVar219) - fVar254 * (auVar89._0_4_ / fVar219);
                auVar242 = ZEXT464((uint)fVar245);
                fVar255 = fVar255 - fVar245;
                auVar256 = ZEXT464((uint)fVar255);
                fVar252 = fVar252 - (fVar254 * (fVar253 / fVar219) -
                                    fVar244 * (auVar90._0_4_ / fVar219));
                auVar248 = ZEXT464((uint)fVar252);
                auVar234._8_4_ = 0x7fffffff;
                auVar234._0_8_ = 0x7fffffff7fffffff;
                auVar234._12_4_ = 0x7fffffff;
                auVar89 = vandps_avx(auVar88,auVar234);
                bVar84 = true;
                if (auVar89._0_4_ < auVar91._0_4_) {
                  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(auVar91._0_4_ + auVar230._0_4_)),
                                            local_7e0,ZEXT416(0x36000000));
                  auVar89 = vandps_avx(ZEXT416((uint)fVar254),auVar234);
                  if (auVar89._0_4_ < auVar90._0_4_) {
                    fVar252 = fVar252 + (float)local_7d0._0_4_;
                    auVar248 = ZEXT464((uint)fVar252);
                    if ((((fVar153 <= fVar252) &&
                         (fVar253 = *(float *)(ray + k * 4 + 0x100), fVar252 <= fVar253)) &&
                        (0.0 <= fVar255)) && (fVar255 <= 1.0)) {
                      auVar142._0_16_ = ZEXT816(0) << 0x20;
                      auVar141._4_28_ = auVar142._4_28_;
                      auVar141._0_4_ = local_8e0._0_4_;
                      auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar141._0_16_);
                      fVar244 = auVar89._0_4_;
                      auVar89 = vmulss_avx512f(local_8e0._0_16_,ZEXT416(0xbf000000));
                      pGVar4 = (context->scene->geometries).items[uVar79].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          bVar77 = true;
                        }
                        else {
                          fVar244 = fVar244 * 1.5 + auVar89._0_4_ * fVar244 * fVar244 * fVar244;
                          auVar191._0_4_ = local_8c0._0_4_ * fVar244;
                          auVar191._4_4_ = local_8c0._4_4_ * fVar244;
                          auVar191._8_4_ = local_8c0._8_4_ * fVar244;
                          auVar191._12_4_ = local_8c0._12_4_ * fVar244;
                          auVar88 = vfmadd213ps_fma(auVar87,auVar191,auVar1);
                          auVar89 = vshufps_avx(auVar191,auVar191,0xc9);
                          auVar87 = vshufps_avx(auVar1,auVar1,0xc9);
                          auVar192._0_4_ = auVar191._0_4_ * auVar87._0_4_;
                          auVar192._4_4_ = auVar191._4_4_ * auVar87._4_4_;
                          auVar192._8_4_ = auVar191._8_4_ * auVar87._8_4_;
                          auVar192._12_4_ = auVar191._12_4_ * auVar87._12_4_;
                          auVar90 = vfmsub231ps_fma(auVar192,auVar1,auVar89);
                          auVar89 = vshufps_avx(auVar90,auVar90,0xc9);
                          auVar87 = vshufps_avx(auVar88,auVar88,0xc9);
                          auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                          auVar163._0_4_ = auVar88._0_4_ * auVar90._0_4_;
                          auVar163._4_4_ = auVar88._4_4_ * auVar90._4_4_;
                          auVar163._8_4_ = auVar88._8_4_ * auVar90._8_4_;
                          auVar163._12_4_ = auVar88._12_4_ * auVar90._12_4_;
                          auVar89 = vfmsub231ps_fma(auVar163,auVar89,auVar87);
                          auVar213._8_4_ = 1;
                          auVar213._0_8_ = 0x100000001;
                          auVar213._12_4_ = 1;
                          auVar213._16_4_ = 1;
                          auVar213._20_4_ = 1;
                          auVar213._24_4_ = 1;
                          auVar213._28_4_ = 1;
                          auVar101 = vpermps_avx2(auVar213,ZEXT1632(auVar89));
                          auVar227._8_4_ = 2;
                          auVar227._0_8_ = 0x200000002;
                          auVar227._12_4_ = 2;
                          auVar227._16_4_ = 2;
                          auVar227._20_4_ = 2;
                          auVar227._24_4_ = 2;
                          auVar227._28_4_ = 2;
                          local_580 = vpermps_avx2(auVar227,ZEXT1632(auVar89));
                          local_560 = auVar89._0_4_;
                          local_5a0[0] = (RTCHitN)auVar101[0];
                          local_5a0[1] = (RTCHitN)auVar101[1];
                          local_5a0[2] = (RTCHitN)auVar101[2];
                          local_5a0[3] = (RTCHitN)auVar101[3];
                          local_5a0[4] = (RTCHitN)auVar101[4];
                          local_5a0[5] = (RTCHitN)auVar101[5];
                          local_5a0[6] = (RTCHitN)auVar101[6];
                          local_5a0[7] = (RTCHitN)auVar101[7];
                          local_5a0[8] = (RTCHitN)auVar101[8];
                          local_5a0[9] = (RTCHitN)auVar101[9];
                          local_5a0[10] = (RTCHitN)auVar101[10];
                          local_5a0[0xb] = (RTCHitN)auVar101[0xb];
                          local_5a0[0xc] = (RTCHitN)auVar101[0xc];
                          local_5a0[0xd] = (RTCHitN)auVar101[0xd];
                          local_5a0[0xe] = (RTCHitN)auVar101[0xe];
                          local_5a0[0xf] = (RTCHitN)auVar101[0xf];
                          local_5a0[0x10] = (RTCHitN)auVar101[0x10];
                          local_5a0[0x11] = (RTCHitN)auVar101[0x11];
                          local_5a0[0x12] = (RTCHitN)auVar101[0x12];
                          local_5a0[0x13] = (RTCHitN)auVar101[0x13];
                          local_5a0[0x14] = (RTCHitN)auVar101[0x14];
                          local_5a0[0x15] = (RTCHitN)auVar101[0x15];
                          local_5a0[0x16] = (RTCHitN)auVar101[0x16];
                          local_5a0[0x17] = (RTCHitN)auVar101[0x17];
                          local_5a0[0x18] = (RTCHitN)auVar101[0x18];
                          local_5a0[0x19] = (RTCHitN)auVar101[0x19];
                          local_5a0[0x1a] = (RTCHitN)auVar101[0x1a];
                          local_5a0[0x1b] = (RTCHitN)auVar101[0x1b];
                          local_5a0[0x1c] = (RTCHitN)auVar101[0x1c];
                          local_5a0[0x1d] = (RTCHitN)auVar101[0x1d];
                          local_5a0[0x1e] = (RTCHitN)auVar101[0x1e];
                          local_5a0[0x1f] = (RTCHitN)auVar101[0x1f];
                          uStack_55c = local_560;
                          uStack_558 = local_560;
                          uStack_554 = local_560;
                          uStack_550 = local_560;
                          uStack_54c = local_560;
                          uStack_548 = local_560;
                          uStack_544 = local_560;
                          local_540 = fVar255;
                          fStack_53c = fVar255;
                          fStack_538 = fVar255;
                          fStack_534 = fVar255;
                          fStack_530 = fVar255;
                          fStack_52c = fVar255;
                          fStack_528 = fVar255;
                          fStack_524 = fVar255;
                          local_520 = ZEXT432(0) << 0x20;
                          local_500 = local_660._0_8_;
                          uStack_4f8 = local_660._8_8_;
                          uStack_4f0 = local_660._16_8_;
                          uStack_4e8 = local_660._24_8_;
                          local_4e0 = local_680;
                          vpcmpeqd_avx2(local_680,local_680);
                          local_4c0 = context->user->instID[0];
                          uStack_4bc = local_4c0;
                          uStack_4b8 = local_4c0;
                          uStack_4b4 = local_4c0;
                          uStack_4b0 = local_4c0;
                          uStack_4ac = local_4c0;
                          uStack_4a8 = local_4c0;
                          uStack_4a4 = local_4c0;
                          local_4a0 = context->user->instPrimID[0];
                          uStack_49c = local_4a0;
                          uStack_498 = local_4a0;
                          uStack_494 = local_4a0;
                          uStack_490 = local_4a0;
                          uStack_48c = local_4a0;
                          uStack_488 = local_4a0;
                          uStack_484 = local_4a0;
                          *(float *)(ray + k * 4 + 0x100) = fVar252;
                          local_800 = local_6a0._0_8_;
                          uStack_7f8 = local_6a0._8_8_;
                          uStack_7f0 = local_6a0._16_8_;
                          uStack_7e8 = local_6a0._24_8_;
                          local_910.valid = (int *)&local_800;
                          local_910.geometryUserPtr = pGVar4->userPtr;
                          local_910.context = context->user;
                          local_910.hit = local_5a0;
                          local_910.N = 8;
                          local_910.ray = (RTCRayN *)ray;
                          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar242 = ZEXT464((uint)fVar245);
                            auVar250 = ZEXT1664(local_8c0._0_16_);
                            auVar258 = ZEXT1664(auVar161);
                            auVar262 = ZEXT1664(auVar1);
                            auVar265 = ZEXT1664(auVar91);
                            (*pGVar4->occlusionFilterN)(&local_910);
                            auVar248 = ZEXT1664(ZEXT416((uint)fVar252));
                            auVar256 = ZEXT1664(ZEXT416((uint)fVar255));
                            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar267 = ZEXT3264(auVar101);
                          }
                          auVar64._8_8_ = uStack_7f8;
                          auVar64._0_8_ = local_800;
                          auVar64._16_8_ = uStack_7f0;
                          auVar64._24_8_ = uStack_7e8;
                          if (auVar64 == (undefined1  [32])0x0) {
                            bVar77 = false;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar242 = ZEXT1664(auVar242._0_16_);
                              auVar250 = ZEXT1664(auVar250._0_16_);
                              auVar258 = ZEXT1664(auVar258._0_16_);
                              auVar262 = ZEXT1664(auVar262._0_16_);
                              auVar265 = ZEXT1664(auVar265._0_16_);
                              (*p_Var5)(&local_910);
                              auVar248 = ZEXT1664(ZEXT416((uint)fVar252));
                              auVar256 = ZEXT1664(ZEXT416((uint)fVar255));
                              auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar267 = ZEXT3264(auVar101);
                            }
                            auVar65._8_8_ = uStack_7f8;
                            auVar65._0_8_ = local_800;
                            auVar65._16_8_ = uStack_7f0;
                            auVar65._24_8_ = uStack_7e8;
                            uVar76 = vptestmd_avx512vl(auVar65,auVar65);
                            auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            bVar84 = (bool)((byte)uVar76 & 1);
                            auVar143._0_4_ =
                                 (uint)bVar84 * auVar101._0_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x100);
                            bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
                            auVar143._4_4_ =
                                 (uint)bVar84 * auVar101._4_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x104);
                            bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
                            auVar143._8_4_ =
                                 (uint)bVar84 * auVar101._8_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x108);
                            bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
                            auVar143._12_4_ =
                                 (uint)bVar84 * auVar101._12_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x10c);
                            bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
                            auVar143._16_4_ =
                                 (uint)bVar84 * auVar101._16_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x110);
                            bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
                            auVar143._20_4_ =
                                 (uint)bVar84 * auVar101._20_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x114);
                            bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
                            auVar143._24_4_ =
                                 (uint)bVar84 * auVar101._24_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x118);
                            bVar84 = SUB81(uVar76 >> 7,0);
                            auVar143._28_4_ =
                                 (uint)bVar84 * auVar101._28_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x11c);
                            *(undefined1 (*) [32])(local_910.ray + 0x100) = auVar143;
                            bVar77 = auVar65 != (undefined1  [32])0x0;
                          }
                          if ((bool)bVar77 == false) {
                            *(float *)(ray + k * 4 + 0x100) = fVar253;
                          }
                        }
                        bVar84 = false;
                        goto LAB_01e124f7;
                      }
                    }
                    bVar84 = false;
                    bVar77 = 0;
                  }
                }
LAB_01e124f7:
                if (!bVar84) goto LAB_01e12820;
                lVar83 = lVar83 + -1;
              } while (lVar83 != 0);
              bVar77 = 0;
LAB_01e12820:
              bVar81 = bVar81 | bVar77 & 1;
              auVar69._4_4_ = fStack_6fc;
              auVar69._0_4_ = local_700;
              auVar69._8_4_ = fStack_6f8;
              auVar69._12_4_ = fStack_6f4;
              auVar69._16_4_ = fStack_6f0;
              auVar69._20_4_ = fStack_6ec;
              auVar69._24_4_ = fStack_6e8;
              auVar69._28_4_ = fStack_6e4;
              uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar29._4_4_ = uVar154;
              auVar29._0_4_ = uVar154;
              auVar29._8_4_ = uVar154;
              auVar29._12_4_ = uVar154;
              auVar29._16_4_ = uVar154;
              auVar29._20_4_ = uVar154;
              auVar29._24_4_ = uVar154;
              auVar29._28_4_ = uVar154;
              uVar15 = vcmpps_avx512vl(auVar69,auVar29,2);
              bVar78 = bVar82 & bVar78 & (byte)uVar15;
            } while (bVar78 != 0);
          }
          uVar17 = vpcmpd_avx512vl(local_640,_local_720,1);
          uVar16 = vpcmpd_avx512vl(local_640,local_440,1);
          auVar193._0_4_ = (float)local_740._0_4_ + (float)local_1c0._0_4_;
          auVar193._4_4_ = (float)local_740._4_4_ + (float)local_1c0._4_4_;
          auVar193._8_4_ = fStack_738 + fStack_1b8;
          auVar193._12_4_ = fStack_734 + fStack_1b4;
          auVar193._16_4_ = fStack_730 + fStack_1b0;
          auVar193._20_4_ = fStack_72c + fStack_1ac;
          auVar193._24_4_ = fStack_728 + fStack_1a8;
          auVar193._28_4_ = fStack_724 + fStack_1a4;
          uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar214._4_4_ = uVar154;
          auVar214._0_4_ = uVar154;
          auVar214._8_4_ = uVar154;
          auVar214._12_4_ = uVar154;
          auVar214._16_4_ = uVar154;
          auVar214._20_4_ = uVar154;
          auVar214._24_4_ = uVar154;
          auVar214._28_4_ = uVar154;
          uVar15 = vcmpps_avx512vl(auVar193,auVar214,2);
          bVar74 = bVar74 & (byte)uVar16 & (byte)uVar15;
          auVar228._0_4_ = (float)local_740._0_4_ + (float)local_480._0_4_;
          auVar228._4_4_ = (float)local_740._4_4_ + (float)local_480._4_4_;
          auVar228._8_4_ = fStack_738 + fStack_478;
          auVar228._12_4_ = fStack_734 + fStack_474;
          auVar228._16_4_ = fStack_730 + fStack_470;
          auVar228._20_4_ = fStack_72c + fStack_46c;
          auVar228._24_4_ = fStack_728 + fStack_468;
          auVar228._28_4_ = fStack_724 + fStack_464;
          uVar15 = vcmpps_avx512vl(auVar228,auVar214,2);
          bVar71 = bVar71 & (byte)uVar17 & (byte)uVar15 | bVar74;
          if (bVar71 == 0) {
            auVar229 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
            auVar215 = ZEXT1664(auVar198);
          }
          else {
            local_180[uVar73 * 0x60] = bVar71;
            auVar144._0_4_ =
                 (uint)(bVar74 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar74 & 1) * local_480._0_4_;
            bVar84 = (bool)(bVar74 >> 1 & 1);
            auVar144._4_4_ = (uint)bVar84 * local_1c0._4_4_ | (uint)!bVar84 * local_480._4_4_;
            bVar84 = (bool)(bVar74 >> 2 & 1);
            auVar144._8_4_ = (uint)bVar84 * (int)fStack_1b8 | (uint)!bVar84 * (int)fStack_478;
            bVar84 = (bool)(bVar74 >> 3 & 1);
            auVar144._12_4_ = (uint)bVar84 * (int)fStack_1b4 | (uint)!bVar84 * (int)fStack_474;
            bVar84 = (bool)(bVar74 >> 4 & 1);
            auVar144._16_4_ = (uint)bVar84 * (int)fStack_1b0 | (uint)!bVar84 * (int)fStack_470;
            bVar84 = (bool)(bVar74 >> 5 & 1);
            auVar144._20_4_ = (uint)bVar84 * (int)fStack_1ac | (uint)!bVar84 * (int)fStack_46c;
            auVar144._24_4_ =
                 (uint)(bVar74 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar74 >> 6) * (int)fStack_468;
            auVar144._28_4_ = fStack_464;
            *(undefined1 (*) [32])(auStack_160 + uVar73 * 0x60) = auVar144;
            auVar215 = ZEXT1664(auVar198);
            uVar15 = vmovlps_avx(auVar198);
            *(undefined8 *)(local_140 + uVar73 * 0x18) = uVar15;
            local_138[uVar73 * 0x18] = iVar3 + 1;
            uVar73 = (ulong)((int)uVar73 + 1);
            auVar229 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
          }
        }
      }
    }
    do {
      if ((int)uVar73 == 0) {
        if (bVar81 != 0) {
          return bVar85;
        }
        uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar31._4_4_ = uVar154;
        auVar31._0_4_ = uVar154;
        auVar31._8_4_ = uVar154;
        auVar31._12_4_ = uVar154;
        auVar31._16_4_ = uVar154;
        auVar31._20_4_ = uVar154;
        auVar31._24_4_ = uVar154;
        auVar31._28_4_ = uVar154;
        uVar15 = vcmpps_avx512vl(local_420,auVar31,2);
        uVar79 = (uint)uVar80 & (uint)uVar15;
        uVar80 = (ulong)uVar79;
        bVar85 = uVar79 != 0;
        if (!bVar85) {
          return bVar85;
        }
        goto LAB_01e1043b;
      }
      uVar76 = (ulong)((int)uVar73 - 1);
      lVar83 = uVar76 * 0x60;
      auVar101 = *(undefined1 (*) [32])(auStack_160 + lVar83);
      auVar194._0_4_ = auVar101._0_4_ + (float)local_740._0_4_;
      auVar194._4_4_ = auVar101._4_4_ + (float)local_740._4_4_;
      auVar194._8_4_ = auVar101._8_4_ + fStack_738;
      auVar194._12_4_ = auVar101._12_4_ + fStack_734;
      auVar194._16_4_ = auVar101._16_4_ + fStack_730;
      auVar194._20_4_ = auVar101._20_4_ + fStack_72c;
      auVar194._24_4_ = auVar101._24_4_ + fStack_728;
      auVar194._28_4_ = auVar101._28_4_ + fStack_724;
      uVar154 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar30._4_4_ = uVar154;
      auVar30._0_4_ = uVar154;
      auVar30._8_4_ = uVar154;
      auVar30._12_4_ = uVar154;
      auVar30._16_4_ = uVar154;
      auVar30._20_4_ = uVar154;
      auVar30._24_4_ = uVar154;
      auVar30._28_4_ = uVar154;
      uVar15 = vcmpps_avx512vl(auVar194,auVar30,2);
      uVar86 = (uint)uVar15 & (uint)local_180[lVar83];
      bVar71 = (byte)uVar86;
      if (uVar86 != 0) {
        auVar195._8_4_ = 0x7f800000;
        auVar195._0_8_ = 0x7f8000007f800000;
        auVar195._12_4_ = 0x7f800000;
        auVar195._16_4_ = 0x7f800000;
        auVar195._20_4_ = 0x7f800000;
        auVar195._24_4_ = 0x7f800000;
        auVar195._28_4_ = 0x7f800000;
        auVar100 = vblendmps_avx512vl(auVar195,auVar101);
        auVar145._0_4_ =
             (uint)(bVar71 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar71 & 1) * (int)auVar101._0_4_;
        bVar84 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar145._4_4_ = (uint)bVar84 * auVar100._4_4_ | (uint)!bVar84 * (int)auVar101._4_4_;
        bVar84 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar145._8_4_ = (uint)bVar84 * auVar100._8_4_ | (uint)!bVar84 * (int)auVar101._8_4_;
        bVar84 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar145._12_4_ = (uint)bVar84 * auVar100._12_4_ | (uint)!bVar84 * (int)auVar101._12_4_;
        bVar84 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar145._16_4_ = (uint)bVar84 * auVar100._16_4_ | (uint)!bVar84 * (int)auVar101._16_4_;
        bVar84 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar145._20_4_ = (uint)bVar84 * auVar100._20_4_ | (uint)!bVar84 * (int)auVar101._20_4_;
        bVar84 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar145._24_4_ = (uint)bVar84 * auVar100._24_4_ | (uint)!bVar84 * (int)auVar101._24_4_;
        auVar145._28_4_ =
             (uVar86 >> 7) * auVar100._28_4_ | (uint)!SUB41(uVar86 >> 7,0) * (int)auVar101._28_4_;
        auVar101 = vshufps_avx(auVar145,auVar145,0xb1);
        auVar101 = vminps_avx(auVar145,auVar101);
        auVar100 = vshufpd_avx(auVar101,auVar101,5);
        auVar101 = vminps_avx(auVar101,auVar100);
        auVar100 = vpermpd_avx2(auVar101,0x4e);
        auVar101 = vminps_avx(auVar101,auVar100);
        uVar15 = vcmpps_avx512vl(auVar145,auVar101,0);
        bVar78 = (byte)uVar15 & bVar71;
        if (bVar78 != 0) {
          uVar86 = (uint)bVar78;
        }
        fVar249 = local_140[uVar76 * 0x18 + 1];
        uVar146 = 0;
        for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
          uVar146 = uVar146 + 1;
        }
        iVar3 = local_138[uVar76 * 0x18];
        bVar78 = ~('\x01' << ((byte)uVar146 & 0x1f)) & bVar71;
        local_180[lVar83] = bVar78;
        uVar75 = uVar76;
        if (bVar78 != 0) {
          uVar75 = uVar73;
        }
        fVar251 = local_140[uVar76 * 0x18];
        auVar196._4_4_ = fVar251;
        auVar196._0_4_ = fVar251;
        auVar196._8_4_ = fVar251;
        auVar196._12_4_ = fVar251;
        auVar196._16_4_ = fVar251;
        auVar196._20_4_ = fVar251;
        auVar196._24_4_ = fVar251;
        auVar196._28_4_ = fVar251;
        fVar249 = fVar249 - fVar251;
        auVar172._4_4_ = fVar249;
        auVar172._0_4_ = fVar249;
        auVar172._8_4_ = fVar249;
        auVar172._12_4_ = fVar249;
        auVar172._16_4_ = fVar249;
        auVar172._20_4_ = fVar249;
        auVar172._24_4_ = fVar249;
        auVar172._28_4_ = fVar249;
        auVar89 = vfmadd132ps_fma(auVar172,auVar196,_DAT_02020f20);
        auVar101 = ZEXT1632(auVar89);
        local_5a0[0] = (RTCHitN)auVar101[0];
        local_5a0[1] = (RTCHitN)auVar101[1];
        local_5a0[2] = (RTCHitN)auVar101[2];
        local_5a0[3] = (RTCHitN)auVar101[3];
        local_5a0[4] = (RTCHitN)auVar101[4];
        local_5a0[5] = (RTCHitN)auVar101[5];
        local_5a0[6] = (RTCHitN)auVar101[6];
        local_5a0[7] = (RTCHitN)auVar101[7];
        local_5a0[8] = (RTCHitN)auVar101[8];
        local_5a0[9] = (RTCHitN)auVar101[9];
        local_5a0[10] = (RTCHitN)auVar101[10];
        local_5a0[0xb] = (RTCHitN)auVar101[0xb];
        local_5a0[0xc] = (RTCHitN)auVar101[0xc];
        local_5a0[0xd] = (RTCHitN)auVar101[0xd];
        local_5a0[0xe] = (RTCHitN)auVar101[0xe];
        local_5a0[0xf] = (RTCHitN)auVar101[0xf];
        local_5a0[0x10] = (RTCHitN)auVar101[0x10];
        local_5a0[0x11] = (RTCHitN)auVar101[0x11];
        local_5a0[0x12] = (RTCHitN)auVar101[0x12];
        local_5a0[0x13] = (RTCHitN)auVar101[0x13];
        local_5a0[0x14] = (RTCHitN)auVar101[0x14];
        local_5a0[0x15] = (RTCHitN)auVar101[0x15];
        local_5a0[0x16] = (RTCHitN)auVar101[0x16];
        local_5a0[0x17] = (RTCHitN)auVar101[0x17];
        local_5a0[0x18] = (RTCHitN)auVar101[0x18];
        local_5a0[0x19] = (RTCHitN)auVar101[0x19];
        local_5a0[0x1a] = (RTCHitN)auVar101[0x1a];
        local_5a0[0x1b] = (RTCHitN)auVar101[0x1b];
        local_5a0[0x1c] = (RTCHitN)auVar101[0x1c];
        local_5a0[0x1d] = (RTCHitN)auVar101[0x1d];
        local_5a0[0x1e] = (RTCHitN)auVar101[0x1e];
        local_5a0[0x1f] = (RTCHitN)auVar101[0x1f];
        auVar215 = ZEXT864(*(ulong *)(local_5a0 + (ulong)uVar146 * 4));
        uVar76 = uVar75;
      }
      uVar73 = uVar76;
    } while (bVar71 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }